

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O0

size_t ZSTD_compressBlock_greedy_row
                 (ZSTD_matchState_t *ms,seqStore_t *seqStore,U32 *rep,void *src,size_t srcSize)

{
  ulong uVar1;
  int iVar2;
  U32 UVar3;
  U32 UVar4;
  uint uVar5;
  uint uVar6;
  size_t sVar7;
  long lVar8;
  BYTE *in_RCX;
  uint *in_RDX;
  long *in_RSI;
  ZSTD_matchState_t *in_RDI;
  long in_R8;
  bool bVar9;
  BYTE *repEnd2;
  BYTE *repMatch_3;
  U32 repIndex_3;
  U32 current2;
  size_t litLength;
  BYTE *mStart;
  BYTE *match;
  U32 matchIndex;
  int gain1_5;
  int gain2_5;
  size_t ml2_2;
  size_t ofbCandidate_1;
  int gain1_4;
  int gain2_4;
  size_t mlRep_3;
  BYTE *repMatchEnd_2;
  BYTE *repMatch_2;
  U32 repIndex_2;
  int gain1_3;
  int gain2_3;
  size_t mlRep_2;
  int gain1_2;
  int gain2_2;
  size_t ml2_1;
  size_t ofbCandidate;
  int gain1_1;
  int gain2_1;
  size_t mlRep_1;
  BYTE *repMatchEnd_1;
  BYTE *repMatch_1;
  U32 repIndex_1;
  int gain1;
  int gain2;
  size_t mlRep;
  size_t step;
  size_t ml2;
  size_t offbaseFound;
  BYTE *repMatchEnd;
  BYTE *repMatch;
  U32 repIndex;
  BYTE *start;
  size_t offBase;
  size_t matchLength;
  U32 maxRep;
  U32 windowLow;
  U32 curr;
  U32 dictAndPrefixLength;
  U32 dictIndexDelta;
  BYTE *dictEnd;
  BYTE *dictLowest;
  BYTE *dictBase;
  U32 dictLowestIndex;
  ZSTD_matchState_t *dms;
  int isDxS;
  int isDDS;
  int isDMS;
  U32 offsetSaved2;
  U32 offsetSaved1;
  U32 offset_2;
  U32 offset_1;
  U32 rowLog;
  U32 mls;
  BYTE *prefixLowest;
  U32 prefixLowestIndex;
  BYTE *base;
  BYTE *ilimit;
  BYTE *iend;
  BYTE *anchor;
  BYTE *ip;
  BYTE *istart;
  size_t mlBase_2;
  BYTE *litEnd_2;
  BYTE *litLimit_w_2;
  size_t mlBase_1;
  BYTE *litEnd_1;
  BYTE *litLimit_w_1;
  size_t mlBase;
  BYTE *litEnd;
  BYTE *litLimit_w;
  BYTE *oend;
  BYTE *op;
  BYTE *ip_1;
  ptrdiff_t diff;
  BYTE *oend_1;
  BYTE *op_1;
  BYTE *ip_2;
  ptrdiff_t diff_1;
  BYTE *oend_2;
  BYTE *op_2;
  BYTE *ip_3;
  ptrdiff_t diff_2;
  U32 row;
  U32 hash;
  U32 lim;
  U32 maxElemsToPrefetch;
  U32 hashLog;
  BYTE *tagTable;
  U32 *hashTable;
  U32 row_1;
  U32 hash_1;
  U32 lim_1;
  U32 maxElemsToPrefetch_1;
  U32 hashLog_1;
  BYTE *tagTable_1;
  U32 *hashTable_1;
  U32 in_stack_fffffffffffff7b8;
  U32 in_stack_fffffffffffff7bc;
  undefined4 in_stack_fffffffffffff7c0;
  undefined4 in_stack_fffffffffffff7c4;
  undefined4 in_stack_fffffffffffff7c8;
  undefined4 in_stack_fffffffffffff7cc;
  U32 in_stack_fffffffffffff7d0;
  uint in_stack_fffffffffffff7d4;
  BYTE *in_stack_fffffffffffff7d8;
  undefined4 in_stack_fffffffffffff7e0;
  U32 in_stack_fffffffffffff7e4;
  BYTE *in_stack_fffffffffffff7e8;
  BYTE *in_stack_fffffffffffff7f0;
  uint in_stack_fffffffffffff7f8;
  uint in_stack_fffffffffffff7fc;
  uint local_800;
  BYTE *local_7f8;
  BYTE *local_7f0;
  uint in_stack_fffffffffffff830;
  uint in_stack_fffffffffffff834;
  BYTE *in_stack_fffffffffffff838;
  BYTE *in_stack_fffffffffffff840;
  ZSTD_matchState_t *in_stack_fffffffffffff848;
  uint in_stack_fffffffffffff8a8;
  uint in_stack_fffffffffffff8ac;
  uint in_stack_fffffffffffff8b0;
  uint in_stack_fffffffffffff8b4;
  uint in_stack_fffffffffffff8b8;
  int in_stack_fffffffffffff8bc;
  ZSTD_matchState_t *in_stack_fffffffffffff8c0;
  BYTE *local_738;
  BYTE *local_728;
  BYTE *local_688;
  BYTE *local_678;
  BYTE *local_5e8;
  BYTE *local_5d8;
  uint local_5c8;
  uint local_5c0;
  uint local_598;
  uint local_594;
  uint local_590;
  uint local_58c;
  uint local_588;
  uint local_584;
  BYTE *local_528;
  ulong local_508;
  int local_500;
  int local_4fc;
  ulong local_4f8;
  BYTE *local_4f0;
  BYTE *local_4e8;
  uint local_4dc;
  int local_4d8;
  int local_4d4;
  ulong local_4d0;
  int local_4c8;
  int local_4c4;
  size_t local_4c0;
  ulong local_4b8;
  int local_4b0;
  int local_4ac;
  ulong local_4a8;
  BYTE *local_4a0;
  BYTE *local_498;
  uint local_48c;
  int local_488;
  int local_484;
  ulong local_480;
  ulong local_478;
  ulong local_470;
  ulong local_468;
  BYTE *local_460;
  BYTE *local_458;
  uint local_44c;
  BYTE *local_448;
  ulong local_440;
  ulong local_438;
  uint local_42c;
  U32 local_428;
  U32 local_424;
  uint local_420;
  uint local_41c;
  BYTE *local_418;
  BYTE *local_410;
  long local_408;
  undefined4 local_3fc;
  ZSTD_matchState_t *local_3f8;
  int local_3ec;
  undefined4 local_3e8;
  undefined4 local_3e4;
  uint local_3e0;
  uint local_3dc;
  uint local_3d8;
  uint local_3d4;
  uint local_3d0;
  uint local_3cc;
  BYTE *local_3c8;
  uint local_3bc;
  BYTE *local_3b8;
  BYTE *local_3b0;
  BYTE *local_3a8;
  BYTE *local_3a0;
  BYTE *local_398;
  int local_384;
  int local_380;
  int local_37c;
  uint *local_368;
  long *local_360;
  ZSTD_matchState_t *local_358;
  ulong local_350;
  BYTE *local_348;
  BYTE *local_340;
  ulong local_338;
  undefined4 local_32c;
  BYTE *local_328;
  BYTE *local_320;
  ulong local_318;
  long *local_310;
  ulong local_308;
  BYTE *local_300;
  BYTE *local_2f8;
  ulong local_2f0;
  undefined4 local_2e4;
  BYTE *local_2e0;
  BYTE *local_2d8;
  ulong local_2d0;
  long *local_2c8;
  ulong local_2c0;
  BYTE *local_2b8;
  BYTE *local_2b0;
  ulong local_2a8;
  undefined4 local_29c;
  BYTE *local_298;
  BYTE *local_290;
  ulong local_288;
  long *local_280;
  void *local_278;
  void *local_270;
  BYTE *local_268;
  long local_260;
  undefined4 local_254;
  long local_250;
  BYTE *local_248;
  void *local_240;
  void *local_238;
  void *local_230;
  BYTE *local_228;
  long local_220;
  undefined4 local_214;
  long local_210;
  BYTE *local_208;
  void *local_200;
  void *local_1f8;
  void *local_1f0;
  BYTE *local_1e8;
  long local_1e0;
  undefined4 local_1d4;
  long local_1d0;
  BYTE *local_1c8;
  void *local_1c0;
  int local_1b4;
  uint local_1b0;
  uint local_1ac;
  uint local_1a8;
  U32 local_1a4;
  BYTE *local_1a0;
  U32 *local_198;
  BYTE *local_190;
  uint local_184;
  uint local_180;
  uint local_17c;
  BYTE *local_178;
  ZSTD_matchState_t *local_170;
  int local_164;
  uint local_160;
  uint local_15c;
  uint local_158;
  U32 local_154;
  BYTE *local_150;
  U32 *local_148;
  BYTE *local_140;
  uint local_134;
  uint local_130;
  uint local_12c;
  BYTE *local_128;
  ZSTD_matchState_t *local_120;
  U64 local_118;
  uint local_110;
  uint local_10c;
  BYTE *local_108;
  size_t local_100;
  U64 local_f8;
  uint local_f0;
  uint local_ec;
  BYTE *local_e8;
  size_t local_e0;
  uint local_d8;
  int local_d4;
  BYTE *local_d0;
  U32 *local_c8;
  uint local_c0;
  int local_bc;
  BYTE *local_b8;
  U32 *local_b0;
  int local_a8;
  int local_a4;
  uint local_a0;
  uint local_9c;
  ulong *local_98;
  BYTE *local_90;
  BYTE *local_88;
  ZSTD_matchState_t *local_80;
  ulong local_78;
  int local_70;
  int local_6c;
  uint local_68;
  uint local_64;
  ulong *local_60;
  BYTE *local_58;
  BYTE *local_50;
  ZSTD_matchState_t *local_48;
  size_t local_40;
  int local_38;
  int local_34;
  uint local_30;
  uint local_2c;
  ulong *local_28;
  BYTE *local_20;
  BYTE *local_18;
  ZSTD_matchState_t *local_10;
  ulong local_8;
  
  local_37c = 2;
  local_380 = 0;
  local_384 = 0;
  local_3a8 = in_RCX + in_R8;
  local_3b0 = local_3a8 + -0x10;
  local_3b8 = (in_RDI->window).base;
  local_3bc = (in_RDI->window).dictLimit;
  local_3c8 = local_3b8 + local_3bc;
  if ((in_RDI->cParams).minMatch < 6) {
    local_584 = (in_RDI->cParams).minMatch;
  }
  else {
    local_584 = 6;
  }
  if (local_584 < 4) {
    local_588 = 4;
  }
  else {
    if ((in_RDI->cParams).minMatch < 6) {
      local_58c = (in_RDI->cParams).minMatch;
    }
    else {
      local_58c = 6;
    }
    local_588 = local_58c;
  }
  local_3cc = local_588;
  if ((in_RDI->cParams).searchLog < 6) {
    local_590 = (in_RDI->cParams).searchLog;
  }
  else {
    local_590 = 6;
  }
  if (local_590 < 4) {
    local_594 = 4;
  }
  else {
    if ((in_RDI->cParams).searchLog < 6) {
      local_598 = (in_RDI->cParams).searchLog;
    }
    else {
      local_598 = 6;
    }
    local_594 = local_598;
  }
  local_3d0 = local_594;
  local_3d4 = *in_RDX;
  local_3d8 = in_RDX[1];
  local_3dc = 0;
  local_3e0 = 0;
  local_3e4 = 0;
  local_3e8 = 0;
  local_3ec = 0;
  local_3f8 = in_RDI->dictMatchState;
  local_3fc = 0;
  local_408 = 0;
  local_410 = (BYTE *)0x0;
  local_418 = (BYTE *)0x0;
  local_41c = 0;
  local_420 = (int)in_RCX - (int)local_3c8;
  local_398 = in_RCX + (int)(uint)(local_420 == 0);
  local_424 = (int)local_398 - (int)local_3b8;
  local_3a0 = in_RCX;
  local_368 = in_RDX;
  local_360 = in_RSI;
  local_358 = in_RDI;
  local_428 = ZSTD_getLowestPrefixIndex(in_RDI,local_424,(in_RDI->cParams).windowLog);
  local_42c = local_424 - local_428;
  if (local_42c < local_3d8) {
    local_3e0 = local_3d8;
    local_3d8 = 0;
  }
  if (local_42c < local_3d4) {
    local_3dc = local_3d4;
    local_3d4 = 0;
  }
  if (local_3ec != 0) {
    if (local_420 < local_3d4) {
      __assert_fail("offset_1 <= dictAndPrefixLength",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                    ,0x7977,
                    "size_t ZSTD_compressBlock_lazy_generic(ZSTD_matchState_t *, seqStore_t *, U32 *, const void *, size_t, const searchMethod_e, const U32, const ZSTD_dictMode_e)"
                   );
    }
    if (local_420 < local_3d8) {
      __assert_fail("offset_2 <= dictAndPrefixLength",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                    ,0x7978,
                    "size_t ZSTD_compressBlock_lazy_generic(ZSTD_matchState_t *, seqStore_t *, U32 *, const void *, size_t, const searchMethod_e, const U32, const ZSTD_dictMode_e)"
                   );
    }
  }
  local_358->lazySkipping = 0;
  if (local_37c == 2) {
    local_184 = local_358->nextToUpdate;
    local_170 = local_358;
    local_178 = local_3b8;
    local_17c = local_3d0;
    local_180 = local_3cc;
    local_190 = local_3b0;
    local_198 = local_358->hashTable;
    local_1a0 = local_358->tagTable;
    local_1a4 = local_358->rowHashLog;
    if (local_3b0 < local_3b8 + local_184) {
      local_5c0 = 0;
    }
    else {
      local_5c0 = ((int)local_3b0 - ((int)local_3b8 + local_184)) + 1;
    }
    local_1a8 = local_5c0;
    if (local_5c0 < 9) {
      local_5c8 = local_5c0;
    }
    else {
      local_5c8 = 8;
    }
    local_1ac = local_184 + local_5c8;
    for (; local_184 < local_1ac; local_184 = local_184 + 1) {
      local_e8 = local_178 + local_184;
      local_ec = local_1a4 + 8;
      local_f8 = local_170->hashSalt;
      local_f0 = local_180;
      if (0x20 < local_ec) {
        __assert_fail("hBits <= 32",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                      ,0x4741,"size_t ZSTD_hashPtrSalted(const void *, U32, U32, const U64)");
      }
      switch(local_180) {
      default:
        local_e0 = ZSTD_hash4PtrS((void *)CONCAT44(in_stack_fffffffffffff7c4,
                                                   in_stack_fffffffffffff7c0),
                                  in_stack_fffffffffffff7bc,in_stack_fffffffffffff7b8);
        break;
      case 5:
        local_e0 = ZSTD_hash5PtrS((void *)CONCAT44(in_stack_fffffffffffff7c4,
                                                   in_stack_fffffffffffff7c0),
                                  in_stack_fffffffffffff7bc,0x25254e);
        break;
      case 6:
        local_e0 = ZSTD_hash6PtrS((void *)CONCAT44(in_stack_fffffffffffff7c4,
                                                   in_stack_fffffffffffff7c0),
                                  in_stack_fffffffffffff7bc,0x252574);
        break;
      case 7:
        local_e0 = ZSTD_hash7PtrS((void *)CONCAT44(in_stack_fffffffffffff7c4,
                                                   in_stack_fffffffffffff7c0),
                                  in_stack_fffffffffffff7bc,0x25259a);
        break;
      case 8:
        local_e0 = ZSTD_hash8PtrS((void *)CONCAT44(in_stack_fffffffffffff7c4,
                                                   in_stack_fffffffffffff7c0),
                                  in_stack_fffffffffffff7bc,0x2525c0);
      }
      local_1b0 = (uint)local_e0;
      local_1b4 = (local_1b0 >> 8) << ((byte)local_17c & 0x1f);
      local_b0 = local_198;
      local_b8 = local_1a0;
      local_c0 = local_17c;
      local_bc = local_1b4;
      if (((local_17c != 4) && (local_17c != 5)) && (local_17c != 6)) {
        __assert_fail("rowLog == 4 || rowLog == 5 || rowLog == 6",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                      ,0x76a1,
                      "void ZSTD_row_prefetch(const U32 *, const BYTE *, const U32, const U32)");
      }
      iVar2 = ZSTD_isAligned((void *)CONCAT44(in_stack_fffffffffffff7c4,in_stack_fffffffffffff7c0),
                             CONCAT44(in_stack_fffffffffffff7bc,in_stack_fffffffffffff7b8));
      if (iVar2 == 0) {
        __assert_fail("ZSTD_isAligned(hashTable + relRow, 64)",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                      ,0x76a2,
                      "void ZSTD_row_prefetch(const U32 *, const BYTE *, const U32, const U32)");
      }
      iVar2 = ZSTD_isAligned((void *)CONCAT44(in_stack_fffffffffffff7c4,in_stack_fffffffffffff7c0),
                             CONCAT44(in_stack_fffffffffffff7bc,in_stack_fffffffffffff7b8));
      if (iVar2 == 0) {
        __assert_fail("ZSTD_isAligned(tagTable + relRow, (size_t)1 << rowLog)",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                      ,0x76a3,
                      "void ZSTD_row_prefetch(const U32 *, const BYTE *, const U32, const U32)");
      }
      local_170->hashCache[local_184 & 7] = local_1b0;
    }
  }
  do {
    while( true ) {
      if (local_3b0 <= local_398) {
        if ((local_3dc != 0) && (local_3d4 != 0)) {
          local_3e0 = local_3dc;
        }
        if (local_3d4 != 0) {
          local_3dc = local_3d4;
        }
        *local_368 = local_3dc;
        if (local_3d8 != 0) {
          local_3e0 = local_3d8;
        }
        local_368[1] = local_3e0;
        return (long)local_3a8 - (long)local_3a0;
      }
      local_438 = 0;
      local_440 = 1;
      local_448 = local_398 + 1;
      local_800 = in_stack_fffffffffffff7f8;
      if (local_3ec == 0) break;
      local_44c = (((int)local_398 - (int)local_3b8) + 1) - local_3d4;
      if (((local_384 == 2) || (local_384 == 3)) && (local_44c < local_3bc)) {
        local_5d8 = (BYTE *)(local_408 + (ulong)(local_44c - local_41c));
      }
      else {
        local_5d8 = local_3b8 + local_44c;
      }
      local_458 = local_5d8;
      if ((local_3bc - 1) - local_44c < 3) break;
      UVar3 = MEM_read32(local_5d8);
      UVar4 = MEM_read32(local_398 + 1);
      local_800 = in_stack_fffffffffffff7f8;
      if (UVar3 != UVar4) break;
      if (local_44c < local_3bc) {
        local_5e8 = local_418;
      }
      else {
        local_5e8 = local_3a8;
      }
      local_460 = local_5e8;
      sVar7 = ZSTD_count_2segments
                        ((BYTE *)CONCAT44(in_stack_fffffffffffff7fc,in_stack_fffffffffffff7f8),
                         in_stack_fffffffffffff7f0,in_stack_fffffffffffff7e8,
                         (BYTE *)CONCAT44(in_stack_fffffffffffff7e4,in_stack_fffffffffffff7e0),
                         in_stack_fffffffffffff7d8);
      local_438 = sVar7 + 4;
      local_800 = in_stack_fffffffffffff7f8;
      if (local_380 != 0) break;
LAB_00257525:
      local_288 = (long)local_448 - (long)local_3a0;
      local_280 = local_360;
      local_290 = local_3a0;
      local_298 = local_3a8;
      local_29c = (undefined4)local_440;
      local_2a8 = local_438;
      local_2b0 = local_3a8 + -0x20;
      local_2b8 = local_3a0 + local_288;
      if ((ulong)local_360[7] <= (ulong)(local_360[1] - *local_360 >> 3)) {
        __assert_fail("(size_t)(seqStorePtr->sequences - seqStorePtr->sequencesStart) < seqStorePtr->maxNbSeq"
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                      ,0x468b,
                      "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                     );
      }
      if (0x20000 < (ulong)local_360[8]) {
        __assert_fail("seqStorePtr->maxNbLit <= 128 KB",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                      ,0x468d,
                      "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                     );
      }
      if ((ulong)(local_360[2] + local_360[8]) < local_360[3] + local_288) {
        __assert_fail("seqStorePtr->lit + litLength <= seqStorePtr->litStart + seqStorePtr->maxNbLit"
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                      ,0x468e,
                      "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                     );
      }
      if (local_3a8 < local_3a0 + local_288) {
        __assert_fail("literals + litLength <= litLimit",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                      ,0x468f,
                      "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                     );
      }
      if (local_2b0 < local_2b8) {
        ZSTD_safecopyLiterals
                  ((BYTE *)CONCAT44(in_stack_fffffffffffff7d4,in_stack_fffffffffffff7d0),
                   (BYTE *)CONCAT44(in_stack_fffffffffffff7cc,in_stack_fffffffffffff7c8),
                   (BYTE *)CONCAT44(in_stack_fffffffffffff7c4,in_stack_fffffffffffff7c0),
                   (BYTE *)CONCAT44(in_stack_fffffffffffff7bc,in_stack_fffffffffffff7b8));
      }
      else {
        ZSTD_copy16((void *)local_360[3],local_3a0);
        if (0x10 < local_288) {
          local_270 = (void *)(local_280[3] + 0x10);
          local_268 = local_290 + 0x10;
          local_250 = local_288 - 0x10;
          local_254 = 0;
          local_260 = (long)local_270 - (long)local_268;
          local_278 = (void *)((long)local_270 + local_250);
          local_248 = local_268;
          local_240 = local_270;
          if ((local_260 < 0x10) && (-0x10 < local_260)) {
            __assert_fail("diff >= WILDCOPY_VECLEN || diff <= -WILDCOPY_VECLEN",
                          "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                          ,0x36a6,
                          "void ZSTD_wildcopy(void *, const void *, ptrdiff_t, const ZSTD_overlap_e)"
                         );
          }
          ZSTD_copy16(local_270,local_268);
          if (0x10 < local_250) {
            local_270 = (void *)((long)local_270 + 0x10);
            local_268 = local_268 + 0x10;
            do {
              ZSTD_copy16(local_270,local_268);
              local_270 = (void *)((long)local_270 + 0x10);
              local_268 = local_268 + 0x10;
              ZSTD_copy16(local_270,local_268);
              local_270 = (void *)((long)local_270 + 0x10);
              local_268 = local_268 + 0x10;
            } while (local_270 < local_278);
          }
        }
      }
      local_280[3] = local_288 + local_280[3];
      if (0xffff < local_288) {
        if ((int)local_280[9] != 0) {
          __assert_fail("seqStorePtr->longLengthType == ZSTD_llt_none",
                        "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                        ,0x46a0,
                        "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                       );
        }
        *(undefined4 *)(local_280 + 9) = 1;
        *(int *)((long)local_280 + 0x4c) = (int)(local_280[1] - *local_280 >> 3);
      }
      *(short *)(local_280[1] + 4) = (short)local_288;
      *(undefined4 *)local_280[1] = local_29c;
      if (local_2a8 < 3) {
        __assert_fail("matchLength >= MINMATCH",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                      ,0x46aa,
                      "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                     );
      }
      local_2c0 = local_2a8 - 3;
      if (0xffff < local_2c0) {
        if ((int)local_280[9] != 0) {
          __assert_fail("seqStorePtr->longLengthType == ZSTD_llt_none",
                        "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                        ,0x46ad,
                        "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                       );
        }
        *(undefined4 *)(local_280 + 9) = 2;
        *(int *)((long)local_280 + 0x4c) = (int)(local_280[1] - *local_280 >> 3);
      }
      *(short *)(local_280[1] + 6) = (short)local_2c0;
      local_280[1] = local_280[1] + 8;
      local_3a0 = local_448 + local_438;
      in_stack_fffffffffffff7f8 = local_800;
      local_398 = local_3a0;
      if (local_358->lazySkipping != 0) {
        if (local_37c == 2) {
          in_stack_fffffffffffff7fc = local_358->nextToUpdate;
          local_120 = local_358;
          local_128 = local_3b8;
          local_12c = local_3d0;
          local_130 = local_3cc;
          local_140 = local_3b0;
          local_148 = local_358->hashTable;
          local_150 = local_358->tagTable;
          local_154 = local_358->rowHashLog;
          if (local_3b0 < local_3b8 + in_stack_fffffffffffff7fc) {
            local_800 = 0;
          }
          else {
            local_800 = ((int)local_3b0 - ((int)local_3b8 + in_stack_fffffffffffff7fc)) + 1;
          }
          local_158 = local_800;
          if (8 < local_800) {
            local_800 = 8;
          }
          local_15c = in_stack_fffffffffffff7fc + local_800;
          for (local_134 = in_stack_fffffffffffff7fc; local_134 < local_15c;
              local_134 = local_134 + 1) {
            local_108 = local_128 + local_134;
            local_10c = local_154 + 8;
            local_118 = local_120->hashSalt;
            local_110 = local_130;
            if (0x20 < local_10c) {
              __assert_fail("hBits <= 32",
                            "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                            ,0x4741,"size_t ZSTD_hashPtrSalted(const void *, U32, U32, const U64)");
            }
            in_stack_fffffffffffff7f0 = (BYTE *)(ulong)(local_130 - 4);
            switch(in_stack_fffffffffffff7f0) {
            default:
              local_100 = ZSTD_hash4PtrS((void *)CONCAT44(in_stack_fffffffffffff7c4,
                                                          in_stack_fffffffffffff7c0),
                                         in_stack_fffffffffffff7bc,in_stack_fffffffffffff7b8);
              break;
            case (BYTE *)0x1:
              local_100 = ZSTD_hash5PtrS((void *)CONCAT44(in_stack_fffffffffffff7c4,
                                                          in_stack_fffffffffffff7c0),
                                         in_stack_fffffffffffff7bc,0x257d7c);
              break;
            case (BYTE *)0x2:
              local_100 = ZSTD_hash6PtrS((void *)CONCAT44(in_stack_fffffffffffff7c4,
                                                          in_stack_fffffffffffff7c0),
                                         in_stack_fffffffffffff7bc,0x257da2);
              break;
            case (BYTE *)0x3:
              local_100 = ZSTD_hash7PtrS((void *)CONCAT44(in_stack_fffffffffffff7c4,
                                                          in_stack_fffffffffffff7c0),
                                         in_stack_fffffffffffff7bc,0x257dc8);
              break;
            case (BYTE *)0x4:
              local_100 = ZSTD_hash8PtrS((void *)CONCAT44(in_stack_fffffffffffff7c4,
                                                          in_stack_fffffffffffff7c0),
                                         in_stack_fffffffffffff7bc,0x257dee);
            }
            local_160 = (uint)local_100;
            local_164 = (local_160 >> 8) << ((byte)local_12c & 0x1f);
            local_c8 = local_148;
            local_d0 = local_150;
            local_d8 = local_12c;
            local_d4 = local_164;
            if (((local_12c != 4) && (local_12c != 5)) && (local_12c != 6)) {
              __assert_fail("rowLog == 4 || rowLog == 5 || rowLog == 6",
                            "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                            ,0x76a1,
                            "void ZSTD_row_prefetch(const U32 *, const BYTE *, const U32, const U32)"
                           );
            }
            iVar2 = ZSTD_isAligned((void *)CONCAT44(in_stack_fffffffffffff7c4,
                                                    in_stack_fffffffffffff7c0),
                                   CONCAT44(in_stack_fffffffffffff7bc,in_stack_fffffffffffff7b8));
            if (iVar2 == 0) {
              __assert_fail("ZSTD_isAligned(hashTable + relRow, 64)",
                            "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                            ,0x76a2,
                            "void ZSTD_row_prefetch(const U32 *, const BYTE *, const U32, const U32)"
                           );
            }
            iVar2 = ZSTD_isAligned((void *)CONCAT44(in_stack_fffffffffffff7c4,
                                                    in_stack_fffffffffffff7c0),
                                   CONCAT44(in_stack_fffffffffffff7bc,in_stack_fffffffffffff7b8));
            if (iVar2 == 0) {
              __assert_fail("ZSTD_isAligned(tagTable + relRow, (size_t)1 << rowLog)",
                            "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                            ,0x76a3,
                            "void ZSTD_row_prefetch(const U32 *, const BYTE *, const U32, const U32)"
                           );
            }
            local_120->hashCache[local_134 & 7] = local_160;
          }
        }
        local_358->lazySkipping = 0;
        in_stack_fffffffffffff7f8 = local_800;
      }
      if (local_3ec != 0) {
        while (local_398 <= local_3b0) {
          uVar6 = ((int)local_398 - (int)local_3b8) - local_3d8;
          if (uVar6 < local_3bc) {
            in_stack_fffffffffffff7e8 = (BYTE *)((local_408 - (ulong)local_41c) + (ulong)uVar6);
          }
          else {
            in_stack_fffffffffffff7e8 = local_3b8 + uVar6;
          }
          if ((local_3bc - 1) - uVar6 < 3) break;
          in_stack_fffffffffffff7e4 = MEM_read32(in_stack_fffffffffffff7e8);
          UVar3 = MEM_read32(local_398);
          if (in_stack_fffffffffffff7e4 != UVar3) break;
          in_stack_fffffffffffff7d8 = local_3a8;
          if (uVar6 < local_3bc) {
            in_stack_fffffffffffff7d8 = local_418;
          }
          sVar7 = ZSTD_count_2segments
                            ((BYTE *)CONCAT44(in_stack_fffffffffffff7fc,in_stack_fffffffffffff7f8),
                             in_stack_fffffffffffff7f0,in_stack_fffffffffffff7e8,
                             (BYTE *)CONCAT44(in_stack_fffffffffffff7e4,in_stack_fffffffffffff7e0),
                             in_stack_fffffffffffff7d8);
          uVar6 = local_3d8;
          local_438 = sVar7 + 4;
          local_440 = (ulong)local_3d8;
          local_3d8 = local_3d4;
          local_3d4 = uVar6;
          local_2c8 = local_360;
          local_2d0 = 0;
          local_2d8 = local_3a0;
          local_2e0 = local_3a8;
          local_2e4 = 1;
          local_2f8 = local_3a8 + -0x20;
          local_300 = local_3a0;
          local_2f0 = local_438;
          if ((ulong)local_360[7] <= (ulong)(local_360[1] - *local_360 >> 3)) {
            __assert_fail("(size_t)(seqStorePtr->sequences - seqStorePtr->sequencesStart) < seqStorePtr->maxNbSeq"
                          ,
                          "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                          ,0x468b,
                          "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                         );
          }
          if (0x20000 < (ulong)local_360[8]) {
            __assert_fail("seqStorePtr->maxNbLit <= 128 KB",
                          "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                          ,0x468d,
                          "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                         );
          }
          if ((ulong)(local_360[2] + local_360[8]) < (ulong)local_360[3]) {
            __assert_fail("seqStorePtr->lit + litLength <= seqStorePtr->litStart + seqStorePtr->maxNbLit"
                          ,
                          "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                          ,0x468e,
                          "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                         );
          }
          if (local_3a8 < local_3a0) {
            __assert_fail("literals + litLength <= litLimit",
                          "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                          ,0x468f,
                          "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                         );
          }
          if (local_2f8 < local_3a0) {
            ZSTD_safecopyLiterals
                      ((BYTE *)CONCAT44(in_stack_fffffffffffff7d4,in_stack_fffffffffffff7d0),
                       (BYTE *)CONCAT44(in_stack_fffffffffffff7cc,in_stack_fffffffffffff7c8),
                       (BYTE *)CONCAT44(in_stack_fffffffffffff7c4,in_stack_fffffffffffff7c0),
                       (BYTE *)CONCAT44(in_stack_fffffffffffff7bc,in_stack_fffffffffffff7b8));
          }
          else {
            ZSTD_copy16((void *)local_360[3],local_3a0);
            if (0x10 < local_2d0) {
              local_230 = (void *)(local_2c8[3] + 0x10);
              local_228 = local_2d8 + 0x10;
              local_210 = local_2d0 - 0x10;
              local_214 = 0;
              local_220 = (long)local_230 - (long)local_228;
              local_238 = (void *)((long)local_230 + local_210);
              local_208 = local_228;
              local_200 = local_230;
              if ((local_220 < 0x10) && (-0x10 < local_220)) {
                __assert_fail("diff >= WILDCOPY_VECLEN || diff <= -WILDCOPY_VECLEN",
                              "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                              ,0x36a6,
                              "void ZSTD_wildcopy(void *, const void *, ptrdiff_t, const ZSTD_overlap_e)"
                             );
              }
              ZSTD_copy16(local_230,local_228);
              if (0x10 < local_210) {
                local_230 = (void *)((long)local_230 + 0x10);
                local_228 = local_228 + 0x10;
                do {
                  ZSTD_copy16(local_230,local_228);
                  local_230 = (void *)((long)local_230 + 0x10);
                  local_228 = local_228 + 0x10;
                  ZSTD_copy16(local_230,local_228);
                  local_230 = (void *)((long)local_230 + 0x10);
                  local_228 = local_228 + 0x10;
                } while (local_230 < local_238);
              }
            }
          }
          local_2c8[3] = local_2d0 + local_2c8[3];
          if (0xffff < local_2d0) {
            if ((int)local_2c8[9] != 0) {
              __assert_fail("seqStorePtr->longLengthType == ZSTD_llt_none",
                            "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                            ,0x46a0,
                            "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                           );
            }
            *(undefined4 *)(local_2c8 + 9) = 1;
            *(int *)((long)local_2c8 + 0x4c) = (int)(local_2c8[1] - *local_2c8 >> 3);
          }
          *(short *)(local_2c8[1] + 4) = (short)local_2d0;
          *(undefined4 *)local_2c8[1] = local_2e4;
          if (local_2f0 < 3) {
            __assert_fail("matchLength >= MINMATCH",
                          "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                          ,0x46aa,
                          "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                         );
          }
          local_308 = local_2f0 - 3;
          if (0xffff < local_308) {
            if ((int)local_2c8[9] != 0) {
              __assert_fail("seqStorePtr->longLengthType == ZSTD_llt_none",
                            "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                            ,0x46ad,
                            "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                           );
            }
            *(undefined4 *)(local_2c8 + 9) = 2;
            *(int *)((long)local_2c8 + 0x4c) = (int)(local_2c8[1] - *local_2c8 >> 3);
          }
          *(short *)(local_2c8[1] + 6) = (short)local_308;
          local_2c8[1] = local_2c8[1] + 8;
          local_3a0 = local_398 + local_438;
          local_398 = local_3a0;
        }
      }
      if (local_384 == 0) {
        while( true ) {
          in_stack_fffffffffffff7d4 = in_stack_fffffffffffff7d4 & 0xffffff;
          if (local_398 <= local_3b0 && local_3d8 != 0) {
            in_stack_fffffffffffff7d0 = MEM_read32(local_398);
            UVar3 = MEM_read32(local_398 + -(ulong)local_3d8);
            in_stack_fffffffffffff7d4 =
                 CONCAT13(in_stack_fffffffffffff7d0 == UVar3,(int3)in_stack_fffffffffffff7d4);
          }
          if ((char)(in_stack_fffffffffffff7d4 >> 0x18) == '\0') break;
          sVar7 = ZSTD_count((BYTE *)CONCAT44(in_stack_fffffffffffff7fc,in_stack_fffffffffffff7f8),
                             in_stack_fffffffffffff7f0,in_stack_fffffffffffff7e8);
          uVar6 = local_3d8;
          local_438 = sVar7 + 4;
          local_440 = (ulong)local_3d8;
          local_3d8 = local_3d4;
          local_3d4 = uVar6;
          local_310 = local_360;
          local_318 = 0;
          local_320 = local_3a0;
          local_328 = local_3a8;
          local_32c = 1;
          local_340 = local_3a8 + -0x20;
          local_348 = local_3a0;
          local_338 = local_438;
          if ((ulong)local_360[7] <= (ulong)(local_360[1] - *local_360 >> 3)) {
            __assert_fail("(size_t)(seqStorePtr->sequences - seqStorePtr->sequencesStart) < seqStorePtr->maxNbSeq"
                          ,
                          "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                          ,0x468b,
                          "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                         );
          }
          if (0x20000 < (ulong)local_360[8]) {
            __assert_fail("seqStorePtr->maxNbLit <= 128 KB",
                          "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                          ,0x468d,
                          "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                         );
          }
          if ((ulong)(local_360[2] + local_360[8]) < (ulong)local_360[3]) {
            __assert_fail("seqStorePtr->lit + litLength <= seqStorePtr->litStart + seqStorePtr->maxNbLit"
                          ,
                          "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                          ,0x468e,
                          "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                         );
          }
          if (local_3a8 < local_3a0) {
            __assert_fail("literals + litLength <= litLimit",
                          "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                          ,0x468f,
                          "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                         );
          }
          if (local_340 < local_3a0) {
            ZSTD_safecopyLiterals
                      ((BYTE *)CONCAT44(in_stack_fffffffffffff7d4,in_stack_fffffffffffff7d0),
                       (BYTE *)CONCAT44(in_stack_fffffffffffff7cc,in_stack_fffffffffffff7c8),
                       (BYTE *)CONCAT44(in_stack_fffffffffffff7c4,in_stack_fffffffffffff7c0),
                       (BYTE *)CONCAT44(in_stack_fffffffffffff7bc,in_stack_fffffffffffff7b8));
          }
          else {
            ZSTD_copy16((void *)local_360[3],local_3a0);
            if (0x10 < local_318) {
              local_1f0 = (void *)(local_310[3] + 0x10);
              local_1e8 = local_320 + 0x10;
              local_1d0 = local_318 - 0x10;
              local_1d4 = 0;
              local_1e0 = (long)local_1f0 - (long)local_1e8;
              local_1f8 = (void *)((long)local_1f0 + local_1d0);
              local_1c8 = local_1e8;
              local_1c0 = local_1f0;
              if ((local_1e0 < 0x10) && (-0x10 < local_1e0)) {
                __assert_fail("diff >= WILDCOPY_VECLEN || diff <= -WILDCOPY_VECLEN",
                              "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                              ,0x36a6,
                              "void ZSTD_wildcopy(void *, const void *, ptrdiff_t, const ZSTD_overlap_e)"
                             );
              }
              ZSTD_copy16(local_1f0,local_1e8);
              if (0x10 < local_1d0) {
                local_1f0 = (void *)((long)local_1f0 + 0x10);
                local_1e8 = local_1e8 + 0x10;
                do {
                  ZSTD_copy16(local_1f0,local_1e8);
                  local_1f0 = (void *)((long)local_1f0 + 0x10);
                  local_1e8 = local_1e8 + 0x10;
                  ZSTD_copy16(local_1f0,local_1e8);
                  local_1f0 = (void *)((long)local_1f0 + 0x10);
                  local_1e8 = local_1e8 + 0x10;
                } while (local_1f0 < local_1f8);
              }
            }
          }
          local_310[3] = local_318 + local_310[3];
          if (0xffff < local_318) {
            if ((int)local_310[9] != 0) {
              __assert_fail("seqStorePtr->longLengthType == ZSTD_llt_none",
                            "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                            ,0x46a0,
                            "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                           );
            }
            *(undefined4 *)(local_310 + 9) = 1;
            *(int *)((long)local_310 + 0x4c) = (int)(local_310[1] - *local_310 >> 3);
          }
          *(short *)(local_310[1] + 4) = (short)local_318;
          *(undefined4 *)local_310[1] = local_32c;
          if (local_338 < 3) {
            __assert_fail("matchLength >= MINMATCH",
                          "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                          ,0x46aa,
                          "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                         );
          }
          local_350 = local_338 - 3;
          if (0xffff < local_350) {
            if ((int)local_310[9] != 0) {
              __assert_fail("seqStorePtr->longLengthType == ZSTD_llt_none",
                            "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                            ,0x46ad,
                            "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                           );
            }
            *(undefined4 *)(local_310 + 9) = 2;
            *(int *)((long)local_310 + 0x4c) = (int)(local_310[1] - *local_310 >> 3);
          }
          *(short *)(local_310[1] + 6) = (short)local_350;
          local_310[1] = local_310[1] + 8;
          local_3a0 = local_398 + local_438;
          local_398 = local_3a0;
        }
      }
    }
    in_stack_fffffffffffff7f8 = local_800;
    if (local_384 == 0) {
      bVar9 = local_3d4 != 0;
      UVar3 = MEM_read32(local_398 + (1 - (ulong)local_3d4));
      UVar4 = MEM_read32(local_398 + 1);
      in_stack_fffffffffffff7f8 = local_800;
      if (bVar9 && UVar3 == UVar4) {
        sVar7 = ZSTD_count((BYTE *)CONCAT44(in_stack_fffffffffffff7fc,local_800),
                           in_stack_fffffffffffff7f0,in_stack_fffffffffffff7e8);
        local_438 = sVar7 + 4;
        in_stack_fffffffffffff7f8 = local_800;
        if (local_380 == 0) goto LAB_00257525;
      }
    }
    local_468 = 999999999;
    local_10 = local_358;
    local_18 = local_398;
    local_20 = local_3a8;
    local_28 = &local_468;
    local_2c = local_3cc;
    local_30 = local_3d0;
    local_34 = local_37c;
    local_38 = local_384;
    if (local_384 == 0) {
      if (local_37c == 0) {
        if (local_3cc == 4) {
          local_8 = ZSTD_HcFindBestMatch_noDict_4
                              (in_stack_fffffffffffff848,in_stack_fffffffffffff840,
                               in_stack_fffffffffffff838,
                               (size_t *)
                               CONCAT44(in_stack_fffffffffffff834,in_stack_fffffffffffff830));
        }
        else if (local_3cc == 5) {
          local_8 = ZSTD_HcFindBestMatch_noDict_5
                              (in_stack_fffffffffffff848,in_stack_fffffffffffff840,
                               in_stack_fffffffffffff838,
                               (size_t *)
                               CONCAT44(in_stack_fffffffffffff834,in_stack_fffffffffffff830));
        }
        else {
          if (local_3cc != 6) goto LAB_00252fd1;
          local_8 = ZSTD_HcFindBestMatch_noDict_6
                              (in_stack_fffffffffffff848,in_stack_fffffffffffff840,
                               in_stack_fffffffffffff838,
                               (size_t *)
                               CONCAT44(in_stack_fffffffffffff834,in_stack_fffffffffffff830));
        }
      }
      else if (local_37c == 1) {
        if (local_3cc == 4) {
          local_8 = ZSTD_BtFindBestMatch_noDict_4
                              ((ZSTD_matchState_t *)
                               CONCAT44(in_stack_fffffffffffff7e4,in_stack_fffffffffffff7e0),
                               in_stack_fffffffffffff7d8,
                               (BYTE *)CONCAT44(in_stack_fffffffffffff7d4,in_stack_fffffffffffff7d0)
                               ,(size_t *)
                                CONCAT44(in_stack_fffffffffffff7cc,in_stack_fffffffffffff7c8));
        }
        else if (local_3cc == 5) {
          local_8 = ZSTD_BtFindBestMatch_noDict_5
                              ((ZSTD_matchState_t *)
                               CONCAT44(in_stack_fffffffffffff7e4,in_stack_fffffffffffff7e0),
                               in_stack_fffffffffffff7d8,
                               (BYTE *)CONCAT44(in_stack_fffffffffffff7d4,in_stack_fffffffffffff7d0)
                               ,(size_t *)
                                CONCAT44(in_stack_fffffffffffff7cc,in_stack_fffffffffffff7c8));
        }
        else {
          if (local_3cc != 6) goto LAB_00252fd1;
          local_8 = ZSTD_BtFindBestMatch_noDict_6
                              ((ZSTD_matchState_t *)
                               CONCAT44(in_stack_fffffffffffff7e4,in_stack_fffffffffffff7e0),
                               in_stack_fffffffffffff7d8,
                               (BYTE *)CONCAT44(in_stack_fffffffffffff7d4,in_stack_fffffffffffff7d0)
                               ,(size_t *)
                                CONCAT44(in_stack_fffffffffffff7cc,in_stack_fffffffffffff7c8));
        }
      }
      else {
        if (local_37c != 2) {
LAB_00252fd1:
          __assert_fail("0",
                        "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                        ,0x7938,
                        "size_t ZSTD_searchMax(ZSTD_matchState_t *, const BYTE *, const BYTE *, size_t *, const U32, const U32, const searchMethod_e, const ZSTD_dictMode_e)"
                       );
        }
        if (local_3cc == 4) {
          if (local_3d0 == 4) {
            local_8 = ZSTD_RowFindBestMatch_noDict_4_4
                                (in_stack_fffffffffffff8c0,
                                 (BYTE *)CONCAT44(in_stack_fffffffffffff8bc,
                                                  in_stack_fffffffffffff8b8),
                                 (BYTE *)CONCAT44(in_stack_fffffffffffff8b4,
                                                  in_stack_fffffffffffff8b0),
                                 (size_t *)
                                 CONCAT44(in_stack_fffffffffffff8ac,in_stack_fffffffffffff8a8));
          }
          else if (local_3d0 == 5) {
            local_8 = ZSTD_RowFindBestMatch_noDict_4_5
                                (in_stack_fffffffffffff8c0,
                                 (BYTE *)CONCAT44(in_stack_fffffffffffff8bc,
                                                  in_stack_fffffffffffff8b8),
                                 (BYTE *)CONCAT44(in_stack_fffffffffffff8b4,
                                                  in_stack_fffffffffffff8b0),
                                 (size_t *)
                                 CONCAT44(in_stack_fffffffffffff8ac,in_stack_fffffffffffff8a8));
          }
          else {
            if (local_3d0 != 6) {
              __assert_fail("0",
                            "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                            ,0x7938,
                            "size_t ZSTD_searchMax(ZSTD_matchState_t *, const BYTE *, const BYTE *, size_t *, const U32, const U32, const searchMethod_e, const ZSTD_dictMode_e)"
                           );
            }
            local_8 = ZSTD_RowFindBestMatch_noDict_4_6
                                (in_stack_fffffffffffff8c0,
                                 (BYTE *)CONCAT44(in_stack_fffffffffffff8bc,
                                                  in_stack_fffffffffffff8b8),
                                 (BYTE *)CONCAT44(in_stack_fffffffffffff8b4,
                                                  in_stack_fffffffffffff8b0),
                                 (size_t *)
                                 CONCAT44(in_stack_fffffffffffff8ac,in_stack_fffffffffffff8a8));
          }
        }
        else if (local_3cc == 5) {
          if (local_3d0 == 4) {
            local_8 = ZSTD_RowFindBestMatch_noDict_5_4
                                (in_stack_fffffffffffff8c0,
                                 (BYTE *)CONCAT44(in_stack_fffffffffffff8bc,
                                                  in_stack_fffffffffffff8b8),
                                 (BYTE *)CONCAT44(in_stack_fffffffffffff8b4,
                                                  in_stack_fffffffffffff8b0),
                                 (size_t *)
                                 CONCAT44(in_stack_fffffffffffff8ac,in_stack_fffffffffffff8a8));
          }
          else if (local_3d0 == 5) {
            local_8 = ZSTD_RowFindBestMatch_noDict_5_5
                                (in_stack_fffffffffffff8c0,
                                 (BYTE *)CONCAT44(in_stack_fffffffffffff8bc,
                                                  in_stack_fffffffffffff8b8),
                                 (BYTE *)CONCAT44(in_stack_fffffffffffff8b4,
                                                  in_stack_fffffffffffff8b0),
                                 (size_t *)
                                 CONCAT44(in_stack_fffffffffffff8ac,in_stack_fffffffffffff8a8));
          }
          else {
            if (local_3d0 != 6) {
              __assert_fail("0",
                            "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                            ,0x7938,
                            "size_t ZSTD_searchMax(ZSTD_matchState_t *, const BYTE *, const BYTE *, size_t *, const U32, const U32, const searchMethod_e, const ZSTD_dictMode_e)"
                           );
            }
            local_8 = ZSTD_RowFindBestMatch_noDict_5_6
                                (in_stack_fffffffffffff8c0,
                                 (BYTE *)CONCAT44(in_stack_fffffffffffff8bc,
                                                  in_stack_fffffffffffff8b8),
                                 (BYTE *)CONCAT44(in_stack_fffffffffffff8b4,
                                                  in_stack_fffffffffffff8b0),
                                 (size_t *)
                                 CONCAT44(in_stack_fffffffffffff8ac,in_stack_fffffffffffff8a8));
          }
        }
        else {
          if (local_3cc != 6) goto LAB_00252fd1;
          if (local_3d0 == 4) {
            local_8 = ZSTD_RowFindBestMatch_noDict_6_4
                                (in_stack_fffffffffffff8c0,
                                 (BYTE *)CONCAT44(in_stack_fffffffffffff8bc,
                                                  in_stack_fffffffffffff8b8),
                                 (BYTE *)CONCAT44(in_stack_fffffffffffff8b4,
                                                  in_stack_fffffffffffff8b0),
                                 (size_t *)
                                 CONCAT44(in_stack_fffffffffffff8ac,in_stack_fffffffffffff8a8));
          }
          else if (local_3d0 == 5) {
            local_8 = ZSTD_RowFindBestMatch_noDict_6_5
                                (in_stack_fffffffffffff8c0,
                                 (BYTE *)CONCAT44(in_stack_fffffffffffff8bc,
                                                  in_stack_fffffffffffff8b8),
                                 (BYTE *)CONCAT44(in_stack_fffffffffffff8b4,
                                                  in_stack_fffffffffffff8b0),
                                 (size_t *)
                                 CONCAT44(in_stack_fffffffffffff8ac,in_stack_fffffffffffff8a8));
          }
          else {
            if (local_3d0 != 6) {
              __assert_fail("0",
                            "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                            ,0x7938,
                            "size_t ZSTD_searchMax(ZSTD_matchState_t *, const BYTE *, const BYTE *, size_t *, const U32, const U32, const searchMethod_e, const ZSTD_dictMode_e)"
                           );
            }
            local_8 = ZSTD_RowFindBestMatch_noDict_6_6
                                (in_stack_fffffffffffff8c0,
                                 (BYTE *)CONCAT44(in_stack_fffffffffffff8bc,
                                                  in_stack_fffffffffffff8b8),
                                 (BYTE *)CONCAT44(in_stack_fffffffffffff8b4,
                                                  in_stack_fffffffffffff8b0),
                                 (size_t *)
                                 CONCAT44(in_stack_fffffffffffff8ac,in_stack_fffffffffffff8a8));
          }
        }
      }
    }
    else if (local_384 == 1) {
      if (local_37c == 0) {
        if (local_3cc == 4) {
          local_8 = ZSTD_HcFindBestMatch_extDict_4
                              (in_stack_fffffffffffff848,in_stack_fffffffffffff840,
                               in_stack_fffffffffffff838,
                               (size_t *)
                               CONCAT44(in_stack_fffffffffffff834,in_stack_fffffffffffff830));
        }
        else if (local_3cc == 5) {
          local_8 = ZSTD_HcFindBestMatch_extDict_5
                              (in_stack_fffffffffffff848,in_stack_fffffffffffff840,
                               in_stack_fffffffffffff838,
                               (size_t *)
                               CONCAT44(in_stack_fffffffffffff834,in_stack_fffffffffffff830));
        }
        else {
          if (local_3cc != 6) goto LAB_002534d0;
          local_8 = ZSTD_HcFindBestMatch_extDict_6
                              (in_stack_fffffffffffff848,in_stack_fffffffffffff840,
                               in_stack_fffffffffffff838,
                               (size_t *)
                               CONCAT44(in_stack_fffffffffffff834,in_stack_fffffffffffff830));
        }
      }
      else if (local_37c == 1) {
        if (local_3cc == 4) {
          local_8 = ZSTD_BtFindBestMatch_extDict_4
                              ((ZSTD_matchState_t *)
                               CONCAT44(in_stack_fffffffffffff7e4,in_stack_fffffffffffff7e0),
                               in_stack_fffffffffffff7d8,
                               (BYTE *)CONCAT44(in_stack_fffffffffffff7d4,in_stack_fffffffffffff7d0)
                               ,(size_t *)
                                CONCAT44(in_stack_fffffffffffff7cc,in_stack_fffffffffffff7c8));
        }
        else if (local_3cc == 5) {
          local_8 = ZSTD_BtFindBestMatch_extDict_5
                              ((ZSTD_matchState_t *)
                               CONCAT44(in_stack_fffffffffffff7e4,in_stack_fffffffffffff7e0),
                               in_stack_fffffffffffff7d8,
                               (BYTE *)CONCAT44(in_stack_fffffffffffff7d4,in_stack_fffffffffffff7d0)
                               ,(size_t *)
                                CONCAT44(in_stack_fffffffffffff7cc,in_stack_fffffffffffff7c8));
        }
        else {
          if (local_3cc != 6) goto LAB_002534d0;
          local_8 = ZSTD_BtFindBestMatch_extDict_6
                              ((ZSTD_matchState_t *)
                               CONCAT44(in_stack_fffffffffffff7e4,in_stack_fffffffffffff7e0),
                               in_stack_fffffffffffff7d8,
                               (BYTE *)CONCAT44(in_stack_fffffffffffff7d4,in_stack_fffffffffffff7d0)
                               ,(size_t *)
                                CONCAT44(in_stack_fffffffffffff7cc,in_stack_fffffffffffff7c8));
        }
      }
      else {
        if (local_37c != 2) {
LAB_002534d0:
          __assert_fail("0",
                        "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                        ,0x793a,
                        "size_t ZSTD_searchMax(ZSTD_matchState_t *, const BYTE *, const BYTE *, size_t *, const U32, const U32, const searchMethod_e, const ZSTD_dictMode_e)"
                       );
        }
        if (local_3cc == 4) {
          if (local_3d0 == 4) {
            local_8 = ZSTD_RowFindBestMatch_extDict_4_4
                                (in_stack_fffffffffffff8c0,
                                 (BYTE *)CONCAT44(in_stack_fffffffffffff8bc,
                                                  in_stack_fffffffffffff8b8),
                                 (BYTE *)CONCAT44(in_stack_fffffffffffff8b4,
                                                  in_stack_fffffffffffff8b0),
                                 (size_t *)
                                 CONCAT44(in_stack_fffffffffffff8ac,in_stack_fffffffffffff8a8));
          }
          else if (local_3d0 == 5) {
            local_8 = ZSTD_RowFindBestMatch_extDict_4_5
                                (in_stack_fffffffffffff8c0,
                                 (BYTE *)CONCAT44(in_stack_fffffffffffff8bc,
                                                  in_stack_fffffffffffff8b8),
                                 (BYTE *)CONCAT44(in_stack_fffffffffffff8b4,
                                                  in_stack_fffffffffffff8b0),
                                 (size_t *)
                                 CONCAT44(in_stack_fffffffffffff8ac,in_stack_fffffffffffff8a8));
          }
          else {
            if (local_3d0 != 6) {
              __assert_fail("0",
                            "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                            ,0x793a,
                            "size_t ZSTD_searchMax(ZSTD_matchState_t *, const BYTE *, const BYTE *, size_t *, const U32, const U32, const searchMethod_e, const ZSTD_dictMode_e)"
                           );
            }
            local_8 = ZSTD_RowFindBestMatch_extDict_4_6
                                (in_stack_fffffffffffff8c0,
                                 (BYTE *)CONCAT44(in_stack_fffffffffffff8bc,
                                                  in_stack_fffffffffffff8b8),
                                 (BYTE *)CONCAT44(in_stack_fffffffffffff8b4,
                                                  in_stack_fffffffffffff8b0),
                                 (size_t *)
                                 CONCAT44(in_stack_fffffffffffff8ac,in_stack_fffffffffffff8a8));
          }
        }
        else if (local_3cc == 5) {
          if (local_3d0 == 4) {
            local_8 = ZSTD_RowFindBestMatch_extDict_5_4
                                (in_stack_fffffffffffff8c0,
                                 (BYTE *)CONCAT44(in_stack_fffffffffffff8bc,
                                                  in_stack_fffffffffffff8b8),
                                 (BYTE *)CONCAT44(in_stack_fffffffffffff8b4,
                                                  in_stack_fffffffffffff8b0),
                                 (size_t *)
                                 CONCAT44(in_stack_fffffffffffff8ac,in_stack_fffffffffffff8a8));
          }
          else if (local_3d0 == 5) {
            local_8 = ZSTD_RowFindBestMatch_extDict_5_5
                                (in_stack_fffffffffffff8c0,
                                 (BYTE *)CONCAT44(in_stack_fffffffffffff8bc,
                                                  in_stack_fffffffffffff8b8),
                                 (BYTE *)CONCAT44(in_stack_fffffffffffff8b4,
                                                  in_stack_fffffffffffff8b0),
                                 (size_t *)
                                 CONCAT44(in_stack_fffffffffffff8ac,in_stack_fffffffffffff8a8));
          }
          else {
            if (local_3d0 != 6) {
              __assert_fail("0",
                            "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                            ,0x793a,
                            "size_t ZSTD_searchMax(ZSTD_matchState_t *, const BYTE *, const BYTE *, size_t *, const U32, const U32, const searchMethod_e, const ZSTD_dictMode_e)"
                           );
            }
            local_8 = ZSTD_RowFindBestMatch_extDict_5_6
                                (in_stack_fffffffffffff8c0,
                                 (BYTE *)CONCAT44(in_stack_fffffffffffff8bc,
                                                  in_stack_fffffffffffff8b8),
                                 (BYTE *)CONCAT44(in_stack_fffffffffffff8b4,
                                                  in_stack_fffffffffffff8b0),
                                 (size_t *)
                                 CONCAT44(in_stack_fffffffffffff8ac,in_stack_fffffffffffff8a8));
          }
        }
        else {
          if (local_3cc != 6) goto LAB_002534d0;
          if (local_3d0 == 4) {
            local_8 = ZSTD_RowFindBestMatch_extDict_6_4
                                (in_stack_fffffffffffff8c0,
                                 (BYTE *)CONCAT44(in_stack_fffffffffffff8bc,
                                                  in_stack_fffffffffffff8b8),
                                 (BYTE *)CONCAT44(in_stack_fffffffffffff8b4,
                                                  in_stack_fffffffffffff8b0),
                                 (size_t *)
                                 CONCAT44(in_stack_fffffffffffff8ac,in_stack_fffffffffffff8a8));
          }
          else if (local_3d0 == 5) {
            local_8 = ZSTD_RowFindBestMatch_extDict_6_5
                                (in_stack_fffffffffffff8c0,
                                 (BYTE *)CONCAT44(in_stack_fffffffffffff8bc,
                                                  in_stack_fffffffffffff8b8),
                                 (BYTE *)CONCAT44(in_stack_fffffffffffff8b4,
                                                  in_stack_fffffffffffff8b0),
                                 (size_t *)
                                 CONCAT44(in_stack_fffffffffffff8ac,in_stack_fffffffffffff8a8));
          }
          else {
            if (local_3d0 != 6) {
              __assert_fail("0",
                            "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                            ,0x793a,
                            "size_t ZSTD_searchMax(ZSTD_matchState_t *, const BYTE *, const BYTE *, size_t *, const U32, const U32, const searchMethod_e, const ZSTD_dictMode_e)"
                           );
            }
            local_8 = ZSTD_RowFindBestMatch_extDict_6_6
                                (in_stack_fffffffffffff8c0,
                                 (BYTE *)CONCAT44(in_stack_fffffffffffff8bc,
                                                  in_stack_fffffffffffff8b8),
                                 (BYTE *)CONCAT44(in_stack_fffffffffffff8b4,
                                                  in_stack_fffffffffffff8b0),
                                 (size_t *)
                                 CONCAT44(in_stack_fffffffffffff8ac,in_stack_fffffffffffff8a8));
          }
        }
      }
    }
    else if (local_384 == 2) {
      if (local_37c == 0) {
        if (local_3cc == 4) {
          local_8 = ZSTD_HcFindBestMatch_dictMatchState_4
                              (in_stack_fffffffffffff848,in_stack_fffffffffffff840,
                               in_stack_fffffffffffff838,
                               (size_t *)
                               CONCAT44(in_stack_fffffffffffff834,in_stack_fffffffffffff830));
        }
        else if (local_3cc == 5) {
          local_8 = ZSTD_HcFindBestMatch_dictMatchState_5
                              (in_stack_fffffffffffff848,in_stack_fffffffffffff840,
                               in_stack_fffffffffffff838,
                               (size_t *)
                               CONCAT44(in_stack_fffffffffffff834,in_stack_fffffffffffff830));
        }
        else {
          if (local_3cc != 6) goto LAB_002539cf;
          local_8 = ZSTD_HcFindBestMatch_dictMatchState_6
                              (in_stack_fffffffffffff848,in_stack_fffffffffffff840,
                               in_stack_fffffffffffff838,
                               (size_t *)
                               CONCAT44(in_stack_fffffffffffff834,in_stack_fffffffffffff830));
        }
      }
      else if (local_37c == 1) {
        if (local_3cc == 4) {
          local_8 = ZSTD_BtFindBestMatch_dictMatchState_4
                              ((ZSTD_matchState_t *)
                               CONCAT44(in_stack_fffffffffffff7e4,in_stack_fffffffffffff7e0),
                               in_stack_fffffffffffff7d8,
                               (BYTE *)CONCAT44(in_stack_fffffffffffff7d4,in_stack_fffffffffffff7d0)
                               ,(size_t *)
                                CONCAT44(in_stack_fffffffffffff7cc,in_stack_fffffffffffff7c8));
        }
        else if (local_3cc == 5) {
          local_8 = ZSTD_BtFindBestMatch_dictMatchState_5
                              ((ZSTD_matchState_t *)
                               CONCAT44(in_stack_fffffffffffff7e4,in_stack_fffffffffffff7e0),
                               in_stack_fffffffffffff7d8,
                               (BYTE *)CONCAT44(in_stack_fffffffffffff7d4,in_stack_fffffffffffff7d0)
                               ,(size_t *)
                                CONCAT44(in_stack_fffffffffffff7cc,in_stack_fffffffffffff7c8));
        }
        else {
          if (local_3cc != 6) goto LAB_002539cf;
          local_8 = ZSTD_BtFindBestMatch_dictMatchState_6
                              ((ZSTD_matchState_t *)
                               CONCAT44(in_stack_fffffffffffff7e4,in_stack_fffffffffffff7e0),
                               in_stack_fffffffffffff7d8,
                               (BYTE *)CONCAT44(in_stack_fffffffffffff7d4,in_stack_fffffffffffff7d0)
                               ,(size_t *)
                                CONCAT44(in_stack_fffffffffffff7cc,in_stack_fffffffffffff7c8));
        }
      }
      else {
        if (local_37c != 2) {
LAB_002539cf:
          __assert_fail("0",
                        "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                        ,0x793c,
                        "size_t ZSTD_searchMax(ZSTD_matchState_t *, const BYTE *, const BYTE *, size_t *, const U32, const U32, const searchMethod_e, const ZSTD_dictMode_e)"
                       );
        }
        if (local_3cc == 4) {
          if (local_3d0 == 4) {
            local_8 = ZSTD_RowFindBestMatch_dictMatchState_4_4
                                (in_stack_fffffffffffff8c0,
                                 (BYTE *)CONCAT44(in_stack_fffffffffffff8bc,
                                                  in_stack_fffffffffffff8b8),
                                 (BYTE *)CONCAT44(in_stack_fffffffffffff8b4,
                                                  in_stack_fffffffffffff8b0),
                                 (size_t *)
                                 CONCAT44(in_stack_fffffffffffff8ac,in_stack_fffffffffffff8a8));
          }
          else if (local_3d0 == 5) {
            local_8 = ZSTD_RowFindBestMatch_dictMatchState_4_5
                                (in_stack_fffffffffffff8c0,
                                 (BYTE *)CONCAT44(in_stack_fffffffffffff8bc,
                                                  in_stack_fffffffffffff8b8),
                                 (BYTE *)CONCAT44(in_stack_fffffffffffff8b4,
                                                  in_stack_fffffffffffff8b0),
                                 (size_t *)
                                 CONCAT44(in_stack_fffffffffffff8ac,in_stack_fffffffffffff8a8));
          }
          else {
            if (local_3d0 != 6) {
              __assert_fail("0",
                            "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                            ,0x793c,
                            "size_t ZSTD_searchMax(ZSTD_matchState_t *, const BYTE *, const BYTE *, size_t *, const U32, const U32, const searchMethod_e, const ZSTD_dictMode_e)"
                           );
            }
            local_8 = ZSTD_RowFindBestMatch_dictMatchState_4_6
                                (in_stack_fffffffffffff8c0,
                                 (BYTE *)CONCAT44(in_stack_fffffffffffff8bc,
                                                  in_stack_fffffffffffff8b8),
                                 (BYTE *)CONCAT44(in_stack_fffffffffffff8b4,
                                                  in_stack_fffffffffffff8b0),
                                 (size_t *)
                                 CONCAT44(in_stack_fffffffffffff8ac,in_stack_fffffffffffff8a8));
          }
        }
        else if (local_3cc == 5) {
          if (local_3d0 == 4) {
            local_8 = ZSTD_RowFindBestMatch_dictMatchState_5_4
                                (in_stack_fffffffffffff8c0,
                                 (BYTE *)CONCAT44(in_stack_fffffffffffff8bc,
                                                  in_stack_fffffffffffff8b8),
                                 (BYTE *)CONCAT44(in_stack_fffffffffffff8b4,
                                                  in_stack_fffffffffffff8b0),
                                 (size_t *)
                                 CONCAT44(in_stack_fffffffffffff8ac,in_stack_fffffffffffff8a8));
          }
          else if (local_3d0 == 5) {
            local_8 = ZSTD_RowFindBestMatch_dictMatchState_5_5
                                (in_stack_fffffffffffff8c0,
                                 (BYTE *)CONCAT44(in_stack_fffffffffffff8bc,
                                                  in_stack_fffffffffffff8b8),
                                 (BYTE *)CONCAT44(in_stack_fffffffffffff8b4,
                                                  in_stack_fffffffffffff8b0),
                                 (size_t *)
                                 CONCAT44(in_stack_fffffffffffff8ac,in_stack_fffffffffffff8a8));
          }
          else {
            if (local_3d0 != 6) {
              __assert_fail("0",
                            "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                            ,0x793c,
                            "size_t ZSTD_searchMax(ZSTD_matchState_t *, const BYTE *, const BYTE *, size_t *, const U32, const U32, const searchMethod_e, const ZSTD_dictMode_e)"
                           );
            }
            local_8 = ZSTD_RowFindBestMatch_dictMatchState_5_6
                                (in_stack_fffffffffffff8c0,
                                 (BYTE *)CONCAT44(in_stack_fffffffffffff8bc,
                                                  in_stack_fffffffffffff8b8),
                                 (BYTE *)CONCAT44(in_stack_fffffffffffff8b4,
                                                  in_stack_fffffffffffff8b0),
                                 (size_t *)
                                 CONCAT44(in_stack_fffffffffffff8ac,in_stack_fffffffffffff8a8));
          }
        }
        else {
          if (local_3cc != 6) goto LAB_002539cf;
          if (local_3d0 == 4) {
            local_8 = ZSTD_RowFindBestMatch_dictMatchState_6_4
                                (in_stack_fffffffffffff8c0,
                                 (BYTE *)CONCAT44(in_stack_fffffffffffff8bc,
                                                  in_stack_fffffffffffff8b8),
                                 (BYTE *)CONCAT44(in_stack_fffffffffffff8b4,
                                                  in_stack_fffffffffffff8b0),
                                 (size_t *)
                                 CONCAT44(in_stack_fffffffffffff8ac,in_stack_fffffffffffff8a8));
          }
          else if (local_3d0 == 5) {
            local_8 = ZSTD_RowFindBestMatch_dictMatchState_6_5
                                (in_stack_fffffffffffff8c0,
                                 (BYTE *)CONCAT44(in_stack_fffffffffffff8bc,
                                                  in_stack_fffffffffffff8b8),
                                 (BYTE *)CONCAT44(in_stack_fffffffffffff8b4,
                                                  in_stack_fffffffffffff8b0),
                                 (size_t *)
                                 CONCAT44(in_stack_fffffffffffff8ac,in_stack_fffffffffffff8a8));
          }
          else {
            if (local_3d0 != 6) {
              __assert_fail("0",
                            "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                            ,0x793c,
                            "size_t ZSTD_searchMax(ZSTD_matchState_t *, const BYTE *, const BYTE *, size_t *, const U32, const U32, const searchMethod_e, const ZSTD_dictMode_e)"
                           );
            }
            local_8 = ZSTD_RowFindBestMatch_dictMatchState_6_6
                                (in_stack_fffffffffffff8c0,
                                 (BYTE *)CONCAT44(in_stack_fffffffffffff8bc,
                                                  in_stack_fffffffffffff8b8),
                                 (BYTE *)CONCAT44(in_stack_fffffffffffff8b4,
                                                  in_stack_fffffffffffff8b0),
                                 (size_t *)
                                 CONCAT44(in_stack_fffffffffffff8ac,in_stack_fffffffffffff8a8));
          }
        }
      }
    }
    else {
      if (local_384 != 3) {
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                      ,0x7940,
                      "size_t ZSTD_searchMax(ZSTD_matchState_t *, const BYTE *, const BYTE *, size_t *, const U32, const U32, const searchMethod_e, const ZSTD_dictMode_e)"
                     );
      }
      if (local_37c == 0) {
        if (local_3cc == 4) {
          local_8 = ZSTD_HcFindBestMatch_dedicatedDictSearch_4
                              (in_stack_fffffffffffff848,in_stack_fffffffffffff840,
                               in_stack_fffffffffffff838,
                               (size_t *)
                               CONCAT44(in_stack_fffffffffffff834,in_stack_fffffffffffff830));
        }
        else if (local_3cc == 5) {
          local_8 = ZSTD_HcFindBestMatch_dedicatedDictSearch_5
                              (in_stack_fffffffffffff848,in_stack_fffffffffffff840,
                               in_stack_fffffffffffff838,
                               (size_t *)
                               CONCAT44(in_stack_fffffffffffff834,in_stack_fffffffffffff830));
        }
        else {
          if (local_3cc != 6) goto LAB_00253ecb;
          local_8 = ZSTD_HcFindBestMatch_dedicatedDictSearch_6
                              (in_stack_fffffffffffff848,in_stack_fffffffffffff840,
                               in_stack_fffffffffffff838,
                               (size_t *)
                               CONCAT44(in_stack_fffffffffffff834,in_stack_fffffffffffff830));
        }
      }
      else if (local_37c == 1) {
        if (local_3cc == 4) {
          local_8 = ZSTD_BtFindBestMatch_dedicatedDictSearch_4
                              ((ZSTD_matchState_t *)
                               CONCAT44(in_stack_fffffffffffff7e4,in_stack_fffffffffffff7e0),
                               in_stack_fffffffffffff7d8,
                               (BYTE *)CONCAT44(in_stack_fffffffffffff7d4,in_stack_fffffffffffff7d0)
                               ,(size_t *)
                                CONCAT44(in_stack_fffffffffffff7cc,in_stack_fffffffffffff7c8));
        }
        else if (local_3cc == 5) {
          local_8 = ZSTD_BtFindBestMatch_dedicatedDictSearch_5
                              ((ZSTD_matchState_t *)
                               CONCAT44(in_stack_fffffffffffff7e4,in_stack_fffffffffffff7e0),
                               in_stack_fffffffffffff7d8,
                               (BYTE *)CONCAT44(in_stack_fffffffffffff7d4,in_stack_fffffffffffff7d0)
                               ,(size_t *)
                                CONCAT44(in_stack_fffffffffffff7cc,in_stack_fffffffffffff7c8));
        }
        else {
          if (local_3cc != 6) goto LAB_00253ecb;
          local_8 = ZSTD_BtFindBestMatch_dedicatedDictSearch_6
                              ((ZSTD_matchState_t *)
                               CONCAT44(in_stack_fffffffffffff7e4,in_stack_fffffffffffff7e0),
                               in_stack_fffffffffffff7d8,
                               (BYTE *)CONCAT44(in_stack_fffffffffffff7d4,in_stack_fffffffffffff7d0)
                               ,(size_t *)
                                CONCAT44(in_stack_fffffffffffff7cc,in_stack_fffffffffffff7c8));
        }
      }
      else {
        if (local_37c != 2) {
LAB_00253ecb:
          __assert_fail("0",
                        "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                        ,0x793e,
                        "size_t ZSTD_searchMax(ZSTD_matchState_t *, const BYTE *, const BYTE *, size_t *, const U32, const U32, const searchMethod_e, const ZSTD_dictMode_e)"
                       );
        }
        if (local_3cc == 4) {
          if (local_3d0 == 4) {
            local_8 = ZSTD_RowFindBestMatch_dedicatedDictSearch_4_4
                                (in_stack_fffffffffffff8c0,
                                 (BYTE *)CONCAT44(in_stack_fffffffffffff8bc,
                                                  in_stack_fffffffffffff8b8),
                                 (BYTE *)CONCAT44(in_stack_fffffffffffff8b4,
                                                  in_stack_fffffffffffff8b0),
                                 (size_t *)
                                 CONCAT44(in_stack_fffffffffffff8ac,in_stack_fffffffffffff8a8));
          }
          else if (local_3d0 == 5) {
            local_8 = ZSTD_RowFindBestMatch_dedicatedDictSearch_4_5
                                (in_stack_fffffffffffff8c0,
                                 (BYTE *)CONCAT44(in_stack_fffffffffffff8bc,
                                                  in_stack_fffffffffffff8b8),
                                 (BYTE *)CONCAT44(in_stack_fffffffffffff8b4,
                                                  in_stack_fffffffffffff8b0),
                                 (size_t *)
                                 CONCAT44(in_stack_fffffffffffff8ac,in_stack_fffffffffffff8a8));
          }
          else {
            if (local_3d0 != 6) {
              __assert_fail("0",
                            "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                            ,0x793e,
                            "size_t ZSTD_searchMax(ZSTD_matchState_t *, const BYTE *, const BYTE *, size_t *, const U32, const U32, const searchMethod_e, const ZSTD_dictMode_e)"
                           );
            }
            local_8 = ZSTD_RowFindBestMatch_dedicatedDictSearch_4_6
                                (in_stack_fffffffffffff8c0,
                                 (BYTE *)CONCAT44(in_stack_fffffffffffff8bc,
                                                  in_stack_fffffffffffff8b8),
                                 (BYTE *)CONCAT44(in_stack_fffffffffffff8b4,
                                                  in_stack_fffffffffffff8b0),
                                 (size_t *)
                                 CONCAT44(in_stack_fffffffffffff8ac,in_stack_fffffffffffff8a8));
          }
        }
        else if (local_3cc == 5) {
          if (local_3d0 == 4) {
            local_8 = ZSTD_RowFindBestMatch_dedicatedDictSearch_5_4
                                (in_stack_fffffffffffff8c0,
                                 (BYTE *)CONCAT44(in_stack_fffffffffffff8bc,
                                                  in_stack_fffffffffffff8b8),
                                 (BYTE *)CONCAT44(in_stack_fffffffffffff8b4,
                                                  in_stack_fffffffffffff8b0),
                                 (size_t *)
                                 CONCAT44(in_stack_fffffffffffff8ac,in_stack_fffffffffffff8a8));
          }
          else if (local_3d0 == 5) {
            local_8 = ZSTD_RowFindBestMatch_dedicatedDictSearch_5_5
                                (in_stack_fffffffffffff8c0,
                                 (BYTE *)CONCAT44(in_stack_fffffffffffff8bc,
                                                  in_stack_fffffffffffff8b8),
                                 (BYTE *)CONCAT44(in_stack_fffffffffffff8b4,
                                                  in_stack_fffffffffffff8b0),
                                 (size_t *)
                                 CONCAT44(in_stack_fffffffffffff8ac,in_stack_fffffffffffff8a8));
          }
          else {
            if (local_3d0 != 6) {
              __assert_fail("0",
                            "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                            ,0x793e,
                            "size_t ZSTD_searchMax(ZSTD_matchState_t *, const BYTE *, const BYTE *, size_t *, const U32, const U32, const searchMethod_e, const ZSTD_dictMode_e)"
                           );
            }
            local_8 = ZSTD_RowFindBestMatch_dedicatedDictSearch_5_6
                                (in_stack_fffffffffffff8c0,
                                 (BYTE *)CONCAT44(in_stack_fffffffffffff8bc,
                                                  in_stack_fffffffffffff8b8),
                                 (BYTE *)CONCAT44(in_stack_fffffffffffff8b4,
                                                  in_stack_fffffffffffff8b0),
                                 (size_t *)
                                 CONCAT44(in_stack_fffffffffffff8ac,in_stack_fffffffffffff8a8));
          }
        }
        else {
          if (local_3cc != 6) goto LAB_00253ecb;
          if (local_3d0 == 4) {
            local_8 = ZSTD_RowFindBestMatch_dedicatedDictSearch_6_4
                                (in_stack_fffffffffffff8c0,
                                 (BYTE *)CONCAT44(in_stack_fffffffffffff8bc,
                                                  in_stack_fffffffffffff8b8),
                                 (BYTE *)CONCAT44(in_stack_fffffffffffff8b4,
                                                  in_stack_fffffffffffff8b0),
                                 (size_t *)
                                 CONCAT44(in_stack_fffffffffffff8ac,in_stack_fffffffffffff8a8));
          }
          else if (local_3d0 == 5) {
            local_8 = ZSTD_RowFindBestMatch_dedicatedDictSearch_6_5
                                (in_stack_fffffffffffff8c0,
                                 (BYTE *)CONCAT44(in_stack_fffffffffffff8bc,
                                                  in_stack_fffffffffffff8b8),
                                 (BYTE *)CONCAT44(in_stack_fffffffffffff8b4,
                                                  in_stack_fffffffffffff8b0),
                                 (size_t *)
                                 CONCAT44(in_stack_fffffffffffff8ac,in_stack_fffffffffffff8a8));
          }
          else {
            if (local_3d0 != 6) {
              __assert_fail("0",
                            "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                            ,0x793e,
                            "size_t ZSTD_searchMax(ZSTD_matchState_t *, const BYTE *, const BYTE *, size_t *, const U32, const U32, const searchMethod_e, const ZSTD_dictMode_e)"
                           );
            }
            local_8 = ZSTD_RowFindBestMatch_dedicatedDictSearch_6_6
                                (in_stack_fffffffffffff8c0,
                                 (BYTE *)CONCAT44(in_stack_fffffffffffff8bc,
                                                  in_stack_fffffffffffff8b8),
                                 (BYTE *)CONCAT44(in_stack_fffffffffffff8b4,
                                                  in_stack_fffffffffffff8b0),
                                 (size_t *)
                                 CONCAT44(in_stack_fffffffffffff8ac,in_stack_fffffffffffff8a8));
          }
        }
      }
    }
    local_470 = local_8;
    if (local_438 < local_8) {
      local_438 = local_8;
      local_448 = local_398;
      local_440 = local_468;
    }
    if (3 < local_438) {
      if (local_380 != 0) {
        while (local_398 < local_3b0) {
          local_398 = local_398 + 1;
          if ((local_384 == 0) && (local_440 != 0)) {
            bVar9 = local_3d4 != 0;
            UVar3 = MEM_read32(local_398);
            UVar4 = MEM_read32(local_398 + -(ulong)local_3d4);
            if (bVar9 && UVar3 == UVar4) {
              sVar7 = ZSTD_count((BYTE *)CONCAT44(in_stack_fffffffffffff7fc,
                                                  in_stack_fffffffffffff7f8),
                                 in_stack_fffffffffffff7f0,in_stack_fffffffffffff7e8);
              local_480 = sVar7 + 4;
              local_484 = (int)local_480 * 3;
              iVar2 = (int)local_438;
              uVar6 = ZSTD_highbit32(0);
              local_488 = (iVar2 * 3 - uVar6) + 1;
              if ((3 < local_480) && (local_488 < local_484)) {
                local_438 = local_480;
                local_440 = 1;
                local_448 = local_398;
              }
            }
          }
          if (local_3ec != 0) {
            local_48c = ((int)local_398 - (int)local_3b8) - local_3d4;
            if (local_48c < local_3bc) {
              local_678 = (BYTE *)(local_408 + (ulong)(local_48c - local_41c));
            }
            else {
              local_678 = local_3b8 + local_48c;
            }
            local_498 = local_678;
            if (2 < (local_3bc - 1) - local_48c) {
              UVar3 = MEM_read32(local_678);
              UVar4 = MEM_read32(local_398);
              if (UVar3 == UVar4) {
                if (local_48c < local_3bc) {
                  local_688 = local_418;
                }
                else {
                  local_688 = local_3a8;
                }
                local_4a0 = local_688;
                sVar7 = ZSTD_count_2segments
                                  ((BYTE *)CONCAT44(in_stack_fffffffffffff7fc,
                                                    in_stack_fffffffffffff7f8),
                                   in_stack_fffffffffffff7f0,in_stack_fffffffffffff7e8,
                                   (BYTE *)CONCAT44(in_stack_fffffffffffff7e4,
                                                    in_stack_fffffffffffff7e0),
                                   in_stack_fffffffffffff7d8);
                local_4a8 = sVar7 + 4;
                local_4ac = (int)local_4a8 * 3;
                iVar2 = (int)local_438;
                uVar6 = ZSTD_highbit32(0);
                local_4b0 = (iVar2 * 3 - uVar6) + 1;
                if ((3 < local_4a8) && (local_4b0 < local_4ac)) {
                  local_438 = local_4a8;
                  local_440 = 1;
                  local_448 = local_398;
                }
              }
            }
          }
          local_4b8 = 999999999;
          local_48 = local_358;
          local_50 = local_398;
          local_58 = local_3a8;
          local_60 = &local_4b8;
          local_64 = local_3cc;
          local_68 = local_3d0;
          local_6c = local_37c;
          local_70 = local_384;
          if (local_384 == 0) {
            if (local_37c == 0) {
              if (local_3cc == 4) {
                local_40 = ZSTD_HcFindBestMatch_noDict_4
                                     (in_stack_fffffffffffff848,in_stack_fffffffffffff840,
                                      in_stack_fffffffffffff838,
                                      (size_t *)
                                      CONCAT44(in_stack_fffffffffffff834,in_stack_fffffffffffff830))
                ;
              }
              else if (local_3cc == 5) {
                local_40 = ZSTD_HcFindBestMatch_noDict_5
                                     (in_stack_fffffffffffff848,in_stack_fffffffffffff840,
                                      in_stack_fffffffffffff838,
                                      (size_t *)
                                      CONCAT44(in_stack_fffffffffffff834,in_stack_fffffffffffff830))
                ;
              }
              else {
                if (local_3cc != 6) goto LAB_002548b6;
                local_40 = ZSTD_HcFindBestMatch_noDict_6
                                     (in_stack_fffffffffffff848,in_stack_fffffffffffff840,
                                      in_stack_fffffffffffff838,
                                      (size_t *)
                                      CONCAT44(in_stack_fffffffffffff834,in_stack_fffffffffffff830))
                ;
              }
            }
            else if (local_37c == 1) {
              if (local_3cc == 4) {
                local_40 = ZSTD_BtFindBestMatch_noDict_4
                                     ((ZSTD_matchState_t *)
                                      CONCAT44(in_stack_fffffffffffff7e4,in_stack_fffffffffffff7e0),
                                      in_stack_fffffffffffff7d8,
                                      (BYTE *)CONCAT44(in_stack_fffffffffffff7d4,
                                                       in_stack_fffffffffffff7d0),
                                      (size_t *)
                                      CONCAT44(in_stack_fffffffffffff7cc,in_stack_fffffffffffff7c8))
                ;
              }
              else if (local_3cc == 5) {
                local_40 = ZSTD_BtFindBestMatch_noDict_5
                                     ((ZSTD_matchState_t *)
                                      CONCAT44(in_stack_fffffffffffff7e4,in_stack_fffffffffffff7e0),
                                      in_stack_fffffffffffff7d8,
                                      (BYTE *)CONCAT44(in_stack_fffffffffffff7d4,
                                                       in_stack_fffffffffffff7d0),
                                      (size_t *)
                                      CONCAT44(in_stack_fffffffffffff7cc,in_stack_fffffffffffff7c8))
                ;
              }
              else {
                if (local_3cc != 6) goto LAB_002548b6;
                local_40 = ZSTD_BtFindBestMatch_noDict_6
                                     ((ZSTD_matchState_t *)
                                      CONCAT44(in_stack_fffffffffffff7e4,in_stack_fffffffffffff7e0),
                                      in_stack_fffffffffffff7d8,
                                      (BYTE *)CONCAT44(in_stack_fffffffffffff7d4,
                                                       in_stack_fffffffffffff7d0),
                                      (size_t *)
                                      CONCAT44(in_stack_fffffffffffff7cc,in_stack_fffffffffffff7c8))
                ;
              }
            }
            else {
              if (local_37c != 2) {
LAB_002548b6:
                __assert_fail("0",
                              "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                              ,0x7938,
                              "size_t ZSTD_searchMax(ZSTD_matchState_t *, const BYTE *, const BYTE *, size_t *, const U32, const U32, const searchMethod_e, const ZSTD_dictMode_e)"
                             );
              }
              if (local_3cc == 4) {
                if (local_3d0 == 4) {
                  local_40 = ZSTD_RowFindBestMatch_noDict_4_4
                                       (in_stack_fffffffffffff8c0,
                                        (BYTE *)CONCAT44(in_stack_fffffffffffff8bc,
                                                         in_stack_fffffffffffff8b8),
                                        (BYTE *)CONCAT44(in_stack_fffffffffffff8b4,
                                                         in_stack_fffffffffffff8b0),
                                        (size_t *)
                                        CONCAT44(in_stack_fffffffffffff8ac,in_stack_fffffffffffff8a8
                                                ));
                }
                else if (local_3d0 == 5) {
                  local_40 = ZSTD_RowFindBestMatch_noDict_4_5
                                       (in_stack_fffffffffffff8c0,
                                        (BYTE *)CONCAT44(in_stack_fffffffffffff8bc,
                                                         in_stack_fffffffffffff8b8),
                                        (BYTE *)CONCAT44(in_stack_fffffffffffff8b4,
                                                         in_stack_fffffffffffff8b0),
                                        (size_t *)
                                        CONCAT44(in_stack_fffffffffffff8ac,in_stack_fffffffffffff8a8
                                                ));
                }
                else {
                  if (local_3d0 != 6) {
                    __assert_fail("0",
                                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                                  ,0x7938,
                                  "size_t ZSTD_searchMax(ZSTD_matchState_t *, const BYTE *, const BYTE *, size_t *, const U32, const U32, const searchMethod_e, const ZSTD_dictMode_e)"
                                 );
                  }
                  local_40 = ZSTD_RowFindBestMatch_noDict_4_6
                                       (in_stack_fffffffffffff8c0,
                                        (BYTE *)CONCAT44(in_stack_fffffffffffff8bc,
                                                         in_stack_fffffffffffff8b8),
                                        (BYTE *)CONCAT44(in_stack_fffffffffffff8b4,
                                                         in_stack_fffffffffffff8b0),
                                        (size_t *)
                                        CONCAT44(in_stack_fffffffffffff8ac,in_stack_fffffffffffff8a8
                                                ));
                }
              }
              else if (local_3cc == 5) {
                if (local_3d0 == 4) {
                  local_40 = ZSTD_RowFindBestMatch_noDict_5_4
                                       (in_stack_fffffffffffff8c0,
                                        (BYTE *)CONCAT44(in_stack_fffffffffffff8bc,
                                                         in_stack_fffffffffffff8b8),
                                        (BYTE *)CONCAT44(in_stack_fffffffffffff8b4,
                                                         in_stack_fffffffffffff8b0),
                                        (size_t *)
                                        CONCAT44(in_stack_fffffffffffff8ac,in_stack_fffffffffffff8a8
                                                ));
                }
                else if (local_3d0 == 5) {
                  local_40 = ZSTD_RowFindBestMatch_noDict_5_5
                                       (in_stack_fffffffffffff8c0,
                                        (BYTE *)CONCAT44(in_stack_fffffffffffff8bc,
                                                         in_stack_fffffffffffff8b8),
                                        (BYTE *)CONCAT44(in_stack_fffffffffffff8b4,
                                                         in_stack_fffffffffffff8b0),
                                        (size_t *)
                                        CONCAT44(in_stack_fffffffffffff8ac,in_stack_fffffffffffff8a8
                                                ));
                }
                else {
                  if (local_3d0 != 6) {
                    __assert_fail("0",
                                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                                  ,0x7938,
                                  "size_t ZSTD_searchMax(ZSTD_matchState_t *, const BYTE *, const BYTE *, size_t *, const U32, const U32, const searchMethod_e, const ZSTD_dictMode_e)"
                                 );
                  }
                  local_40 = ZSTD_RowFindBestMatch_noDict_5_6
                                       (in_stack_fffffffffffff8c0,
                                        (BYTE *)CONCAT44(in_stack_fffffffffffff8bc,
                                                         in_stack_fffffffffffff8b8),
                                        (BYTE *)CONCAT44(in_stack_fffffffffffff8b4,
                                                         in_stack_fffffffffffff8b0),
                                        (size_t *)
                                        CONCAT44(in_stack_fffffffffffff8ac,in_stack_fffffffffffff8a8
                                                ));
                }
              }
              else {
                if (local_3cc != 6) goto LAB_002548b6;
                if (local_3d0 == 4) {
                  local_40 = ZSTD_RowFindBestMatch_noDict_6_4
                                       (in_stack_fffffffffffff8c0,
                                        (BYTE *)CONCAT44(in_stack_fffffffffffff8bc,
                                                         in_stack_fffffffffffff8b8),
                                        (BYTE *)CONCAT44(in_stack_fffffffffffff8b4,
                                                         in_stack_fffffffffffff8b0),
                                        (size_t *)
                                        CONCAT44(in_stack_fffffffffffff8ac,in_stack_fffffffffffff8a8
                                                ));
                }
                else if (local_3d0 == 5) {
                  local_40 = ZSTD_RowFindBestMatch_noDict_6_5
                                       (in_stack_fffffffffffff8c0,
                                        (BYTE *)CONCAT44(in_stack_fffffffffffff8bc,
                                                         in_stack_fffffffffffff8b8),
                                        (BYTE *)CONCAT44(in_stack_fffffffffffff8b4,
                                                         in_stack_fffffffffffff8b0),
                                        (size_t *)
                                        CONCAT44(in_stack_fffffffffffff8ac,in_stack_fffffffffffff8a8
                                                ));
                }
                else {
                  if (local_3d0 != 6) {
                    __assert_fail("0",
                                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                                  ,0x7938,
                                  "size_t ZSTD_searchMax(ZSTD_matchState_t *, const BYTE *, const BYTE *, size_t *, const U32, const U32, const searchMethod_e, const ZSTD_dictMode_e)"
                                 );
                  }
                  local_40 = ZSTD_RowFindBestMatch_noDict_6_6
                                       (in_stack_fffffffffffff8c0,
                                        (BYTE *)CONCAT44(in_stack_fffffffffffff8bc,
                                                         in_stack_fffffffffffff8b8),
                                        (BYTE *)CONCAT44(in_stack_fffffffffffff8b4,
                                                         in_stack_fffffffffffff8b0),
                                        (size_t *)
                                        CONCAT44(in_stack_fffffffffffff8ac,in_stack_fffffffffffff8a8
                                                ));
                }
              }
            }
          }
          else if (local_384 == 1) {
            if (local_37c == 0) {
              if (local_3cc == 4) {
                local_40 = ZSTD_HcFindBestMatch_extDict_4
                                     (in_stack_fffffffffffff848,in_stack_fffffffffffff840,
                                      in_stack_fffffffffffff838,
                                      (size_t *)
                                      CONCAT44(in_stack_fffffffffffff834,in_stack_fffffffffffff830))
                ;
              }
              else if (local_3cc == 5) {
                local_40 = ZSTD_HcFindBestMatch_extDict_5
                                     (in_stack_fffffffffffff848,in_stack_fffffffffffff840,
                                      in_stack_fffffffffffff838,
                                      (size_t *)
                                      CONCAT44(in_stack_fffffffffffff834,in_stack_fffffffffffff830))
                ;
              }
              else {
                if (local_3cc != 6) goto LAB_00254db5;
                local_40 = ZSTD_HcFindBestMatch_extDict_6
                                     (in_stack_fffffffffffff848,in_stack_fffffffffffff840,
                                      in_stack_fffffffffffff838,
                                      (size_t *)
                                      CONCAT44(in_stack_fffffffffffff834,in_stack_fffffffffffff830))
                ;
              }
            }
            else if (local_37c == 1) {
              if (local_3cc == 4) {
                local_40 = ZSTD_BtFindBestMatch_extDict_4
                                     ((ZSTD_matchState_t *)
                                      CONCAT44(in_stack_fffffffffffff7e4,in_stack_fffffffffffff7e0),
                                      in_stack_fffffffffffff7d8,
                                      (BYTE *)CONCAT44(in_stack_fffffffffffff7d4,
                                                       in_stack_fffffffffffff7d0),
                                      (size_t *)
                                      CONCAT44(in_stack_fffffffffffff7cc,in_stack_fffffffffffff7c8))
                ;
              }
              else if (local_3cc == 5) {
                local_40 = ZSTD_BtFindBestMatch_extDict_5
                                     ((ZSTD_matchState_t *)
                                      CONCAT44(in_stack_fffffffffffff7e4,in_stack_fffffffffffff7e0),
                                      in_stack_fffffffffffff7d8,
                                      (BYTE *)CONCAT44(in_stack_fffffffffffff7d4,
                                                       in_stack_fffffffffffff7d0),
                                      (size_t *)
                                      CONCAT44(in_stack_fffffffffffff7cc,in_stack_fffffffffffff7c8))
                ;
              }
              else {
                if (local_3cc != 6) goto LAB_00254db5;
                local_40 = ZSTD_BtFindBestMatch_extDict_6
                                     ((ZSTD_matchState_t *)
                                      CONCAT44(in_stack_fffffffffffff7e4,in_stack_fffffffffffff7e0),
                                      in_stack_fffffffffffff7d8,
                                      (BYTE *)CONCAT44(in_stack_fffffffffffff7d4,
                                                       in_stack_fffffffffffff7d0),
                                      (size_t *)
                                      CONCAT44(in_stack_fffffffffffff7cc,in_stack_fffffffffffff7c8))
                ;
              }
            }
            else {
              if (local_37c != 2) {
LAB_00254db5:
                __assert_fail("0",
                              "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                              ,0x793a,
                              "size_t ZSTD_searchMax(ZSTD_matchState_t *, const BYTE *, const BYTE *, size_t *, const U32, const U32, const searchMethod_e, const ZSTD_dictMode_e)"
                             );
              }
              if (local_3cc == 4) {
                if (local_3d0 == 4) {
                  local_40 = ZSTD_RowFindBestMatch_extDict_4_4
                                       (in_stack_fffffffffffff8c0,
                                        (BYTE *)CONCAT44(in_stack_fffffffffffff8bc,
                                                         in_stack_fffffffffffff8b8),
                                        (BYTE *)CONCAT44(in_stack_fffffffffffff8b4,
                                                         in_stack_fffffffffffff8b0),
                                        (size_t *)
                                        CONCAT44(in_stack_fffffffffffff8ac,in_stack_fffffffffffff8a8
                                                ));
                }
                else if (local_3d0 == 5) {
                  local_40 = ZSTD_RowFindBestMatch_extDict_4_5
                                       (in_stack_fffffffffffff8c0,
                                        (BYTE *)CONCAT44(in_stack_fffffffffffff8bc,
                                                         in_stack_fffffffffffff8b8),
                                        (BYTE *)CONCAT44(in_stack_fffffffffffff8b4,
                                                         in_stack_fffffffffffff8b0),
                                        (size_t *)
                                        CONCAT44(in_stack_fffffffffffff8ac,in_stack_fffffffffffff8a8
                                                ));
                }
                else {
                  if (local_3d0 != 6) {
                    __assert_fail("0",
                                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                                  ,0x793a,
                                  "size_t ZSTD_searchMax(ZSTD_matchState_t *, const BYTE *, const BYTE *, size_t *, const U32, const U32, const searchMethod_e, const ZSTD_dictMode_e)"
                                 );
                  }
                  local_40 = ZSTD_RowFindBestMatch_extDict_4_6
                                       (in_stack_fffffffffffff8c0,
                                        (BYTE *)CONCAT44(in_stack_fffffffffffff8bc,
                                                         in_stack_fffffffffffff8b8),
                                        (BYTE *)CONCAT44(in_stack_fffffffffffff8b4,
                                                         in_stack_fffffffffffff8b0),
                                        (size_t *)
                                        CONCAT44(in_stack_fffffffffffff8ac,in_stack_fffffffffffff8a8
                                                ));
                }
              }
              else if (local_3cc == 5) {
                if (local_3d0 == 4) {
                  local_40 = ZSTD_RowFindBestMatch_extDict_5_4
                                       (in_stack_fffffffffffff8c0,
                                        (BYTE *)CONCAT44(in_stack_fffffffffffff8bc,
                                                         in_stack_fffffffffffff8b8),
                                        (BYTE *)CONCAT44(in_stack_fffffffffffff8b4,
                                                         in_stack_fffffffffffff8b0),
                                        (size_t *)
                                        CONCAT44(in_stack_fffffffffffff8ac,in_stack_fffffffffffff8a8
                                                ));
                }
                else if (local_3d0 == 5) {
                  local_40 = ZSTD_RowFindBestMatch_extDict_5_5
                                       (in_stack_fffffffffffff8c0,
                                        (BYTE *)CONCAT44(in_stack_fffffffffffff8bc,
                                                         in_stack_fffffffffffff8b8),
                                        (BYTE *)CONCAT44(in_stack_fffffffffffff8b4,
                                                         in_stack_fffffffffffff8b0),
                                        (size_t *)
                                        CONCAT44(in_stack_fffffffffffff8ac,in_stack_fffffffffffff8a8
                                                ));
                }
                else {
                  if (local_3d0 != 6) {
                    __assert_fail("0",
                                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                                  ,0x793a,
                                  "size_t ZSTD_searchMax(ZSTD_matchState_t *, const BYTE *, const BYTE *, size_t *, const U32, const U32, const searchMethod_e, const ZSTD_dictMode_e)"
                                 );
                  }
                  local_40 = ZSTD_RowFindBestMatch_extDict_5_6
                                       (in_stack_fffffffffffff8c0,
                                        (BYTE *)CONCAT44(in_stack_fffffffffffff8bc,
                                                         in_stack_fffffffffffff8b8),
                                        (BYTE *)CONCAT44(in_stack_fffffffffffff8b4,
                                                         in_stack_fffffffffffff8b0),
                                        (size_t *)
                                        CONCAT44(in_stack_fffffffffffff8ac,in_stack_fffffffffffff8a8
                                                ));
                }
              }
              else {
                if (local_3cc != 6) goto LAB_00254db5;
                if (local_3d0 == 4) {
                  local_40 = ZSTD_RowFindBestMatch_extDict_6_4
                                       (in_stack_fffffffffffff8c0,
                                        (BYTE *)CONCAT44(in_stack_fffffffffffff8bc,
                                                         in_stack_fffffffffffff8b8),
                                        (BYTE *)CONCAT44(in_stack_fffffffffffff8b4,
                                                         in_stack_fffffffffffff8b0),
                                        (size_t *)
                                        CONCAT44(in_stack_fffffffffffff8ac,in_stack_fffffffffffff8a8
                                                ));
                }
                else if (local_3d0 == 5) {
                  local_40 = ZSTD_RowFindBestMatch_extDict_6_5
                                       (in_stack_fffffffffffff8c0,
                                        (BYTE *)CONCAT44(in_stack_fffffffffffff8bc,
                                                         in_stack_fffffffffffff8b8),
                                        (BYTE *)CONCAT44(in_stack_fffffffffffff8b4,
                                                         in_stack_fffffffffffff8b0),
                                        (size_t *)
                                        CONCAT44(in_stack_fffffffffffff8ac,in_stack_fffffffffffff8a8
                                                ));
                }
                else {
                  if (local_3d0 != 6) {
                    __assert_fail("0",
                                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                                  ,0x793a,
                                  "size_t ZSTD_searchMax(ZSTD_matchState_t *, const BYTE *, const BYTE *, size_t *, const U32, const U32, const searchMethod_e, const ZSTD_dictMode_e)"
                                 );
                  }
                  local_40 = ZSTD_RowFindBestMatch_extDict_6_6
                                       (in_stack_fffffffffffff8c0,
                                        (BYTE *)CONCAT44(in_stack_fffffffffffff8bc,
                                                         in_stack_fffffffffffff8b8),
                                        (BYTE *)CONCAT44(in_stack_fffffffffffff8b4,
                                                         in_stack_fffffffffffff8b0),
                                        (size_t *)
                                        CONCAT44(in_stack_fffffffffffff8ac,in_stack_fffffffffffff8a8
                                                ));
                }
              }
            }
          }
          else if (local_384 == 2) {
            if (local_37c == 0) {
              if (local_3cc == 4) {
                local_40 = ZSTD_HcFindBestMatch_dictMatchState_4
                                     (in_stack_fffffffffffff848,in_stack_fffffffffffff840,
                                      in_stack_fffffffffffff838,
                                      (size_t *)
                                      CONCAT44(in_stack_fffffffffffff834,in_stack_fffffffffffff830))
                ;
              }
              else if (local_3cc == 5) {
                local_40 = ZSTD_HcFindBestMatch_dictMatchState_5
                                     (in_stack_fffffffffffff848,in_stack_fffffffffffff840,
                                      in_stack_fffffffffffff838,
                                      (size_t *)
                                      CONCAT44(in_stack_fffffffffffff834,in_stack_fffffffffffff830))
                ;
              }
              else {
                if (local_3cc != 6) goto LAB_002552b4;
                local_40 = ZSTD_HcFindBestMatch_dictMatchState_6
                                     (in_stack_fffffffffffff848,in_stack_fffffffffffff840,
                                      in_stack_fffffffffffff838,
                                      (size_t *)
                                      CONCAT44(in_stack_fffffffffffff834,in_stack_fffffffffffff830))
                ;
              }
            }
            else if (local_37c == 1) {
              if (local_3cc == 4) {
                local_40 = ZSTD_BtFindBestMatch_dictMatchState_4
                                     ((ZSTD_matchState_t *)
                                      CONCAT44(in_stack_fffffffffffff7e4,in_stack_fffffffffffff7e0),
                                      in_stack_fffffffffffff7d8,
                                      (BYTE *)CONCAT44(in_stack_fffffffffffff7d4,
                                                       in_stack_fffffffffffff7d0),
                                      (size_t *)
                                      CONCAT44(in_stack_fffffffffffff7cc,in_stack_fffffffffffff7c8))
                ;
              }
              else if (local_3cc == 5) {
                local_40 = ZSTD_BtFindBestMatch_dictMatchState_5
                                     ((ZSTD_matchState_t *)
                                      CONCAT44(in_stack_fffffffffffff7e4,in_stack_fffffffffffff7e0),
                                      in_stack_fffffffffffff7d8,
                                      (BYTE *)CONCAT44(in_stack_fffffffffffff7d4,
                                                       in_stack_fffffffffffff7d0),
                                      (size_t *)
                                      CONCAT44(in_stack_fffffffffffff7cc,in_stack_fffffffffffff7c8))
                ;
              }
              else {
                if (local_3cc != 6) goto LAB_002552b4;
                local_40 = ZSTD_BtFindBestMatch_dictMatchState_6
                                     ((ZSTD_matchState_t *)
                                      CONCAT44(in_stack_fffffffffffff7e4,in_stack_fffffffffffff7e0),
                                      in_stack_fffffffffffff7d8,
                                      (BYTE *)CONCAT44(in_stack_fffffffffffff7d4,
                                                       in_stack_fffffffffffff7d0),
                                      (size_t *)
                                      CONCAT44(in_stack_fffffffffffff7cc,in_stack_fffffffffffff7c8))
                ;
              }
            }
            else {
              if (local_37c != 2) {
LAB_002552b4:
                __assert_fail("0",
                              "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                              ,0x793c,
                              "size_t ZSTD_searchMax(ZSTD_matchState_t *, const BYTE *, const BYTE *, size_t *, const U32, const U32, const searchMethod_e, const ZSTD_dictMode_e)"
                             );
              }
              if (local_3cc == 4) {
                if (local_3d0 == 4) {
                  local_40 = ZSTD_RowFindBestMatch_dictMatchState_4_4
                                       (in_stack_fffffffffffff8c0,
                                        (BYTE *)CONCAT44(in_stack_fffffffffffff8bc,
                                                         in_stack_fffffffffffff8b8),
                                        (BYTE *)CONCAT44(in_stack_fffffffffffff8b4,
                                                         in_stack_fffffffffffff8b0),
                                        (size_t *)
                                        CONCAT44(in_stack_fffffffffffff8ac,in_stack_fffffffffffff8a8
                                                ));
                }
                else if (local_3d0 == 5) {
                  local_40 = ZSTD_RowFindBestMatch_dictMatchState_4_5
                                       (in_stack_fffffffffffff8c0,
                                        (BYTE *)CONCAT44(in_stack_fffffffffffff8bc,
                                                         in_stack_fffffffffffff8b8),
                                        (BYTE *)CONCAT44(in_stack_fffffffffffff8b4,
                                                         in_stack_fffffffffffff8b0),
                                        (size_t *)
                                        CONCAT44(in_stack_fffffffffffff8ac,in_stack_fffffffffffff8a8
                                                ));
                }
                else {
                  if (local_3d0 != 6) {
                    __assert_fail("0",
                                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                                  ,0x793c,
                                  "size_t ZSTD_searchMax(ZSTD_matchState_t *, const BYTE *, const BYTE *, size_t *, const U32, const U32, const searchMethod_e, const ZSTD_dictMode_e)"
                                 );
                  }
                  local_40 = ZSTD_RowFindBestMatch_dictMatchState_4_6
                                       (in_stack_fffffffffffff8c0,
                                        (BYTE *)CONCAT44(in_stack_fffffffffffff8bc,
                                                         in_stack_fffffffffffff8b8),
                                        (BYTE *)CONCAT44(in_stack_fffffffffffff8b4,
                                                         in_stack_fffffffffffff8b0),
                                        (size_t *)
                                        CONCAT44(in_stack_fffffffffffff8ac,in_stack_fffffffffffff8a8
                                                ));
                }
              }
              else if (local_3cc == 5) {
                if (local_3d0 == 4) {
                  local_40 = ZSTD_RowFindBestMatch_dictMatchState_5_4
                                       (in_stack_fffffffffffff8c0,
                                        (BYTE *)CONCAT44(in_stack_fffffffffffff8bc,
                                                         in_stack_fffffffffffff8b8),
                                        (BYTE *)CONCAT44(in_stack_fffffffffffff8b4,
                                                         in_stack_fffffffffffff8b0),
                                        (size_t *)
                                        CONCAT44(in_stack_fffffffffffff8ac,in_stack_fffffffffffff8a8
                                                ));
                }
                else if (local_3d0 == 5) {
                  local_40 = ZSTD_RowFindBestMatch_dictMatchState_5_5
                                       (in_stack_fffffffffffff8c0,
                                        (BYTE *)CONCAT44(in_stack_fffffffffffff8bc,
                                                         in_stack_fffffffffffff8b8),
                                        (BYTE *)CONCAT44(in_stack_fffffffffffff8b4,
                                                         in_stack_fffffffffffff8b0),
                                        (size_t *)
                                        CONCAT44(in_stack_fffffffffffff8ac,in_stack_fffffffffffff8a8
                                                ));
                }
                else {
                  if (local_3d0 != 6) {
                    __assert_fail("0",
                                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                                  ,0x793c,
                                  "size_t ZSTD_searchMax(ZSTD_matchState_t *, const BYTE *, const BYTE *, size_t *, const U32, const U32, const searchMethod_e, const ZSTD_dictMode_e)"
                                 );
                  }
                  local_40 = ZSTD_RowFindBestMatch_dictMatchState_5_6
                                       (in_stack_fffffffffffff8c0,
                                        (BYTE *)CONCAT44(in_stack_fffffffffffff8bc,
                                                         in_stack_fffffffffffff8b8),
                                        (BYTE *)CONCAT44(in_stack_fffffffffffff8b4,
                                                         in_stack_fffffffffffff8b0),
                                        (size_t *)
                                        CONCAT44(in_stack_fffffffffffff8ac,in_stack_fffffffffffff8a8
                                                ));
                }
              }
              else {
                if (local_3cc != 6) goto LAB_002552b4;
                if (local_3d0 == 4) {
                  local_40 = ZSTD_RowFindBestMatch_dictMatchState_6_4
                                       (in_stack_fffffffffffff8c0,
                                        (BYTE *)CONCAT44(in_stack_fffffffffffff8bc,
                                                         in_stack_fffffffffffff8b8),
                                        (BYTE *)CONCAT44(in_stack_fffffffffffff8b4,
                                                         in_stack_fffffffffffff8b0),
                                        (size_t *)
                                        CONCAT44(in_stack_fffffffffffff8ac,in_stack_fffffffffffff8a8
                                                ));
                }
                else if (local_3d0 == 5) {
                  local_40 = ZSTD_RowFindBestMatch_dictMatchState_6_5
                                       (in_stack_fffffffffffff8c0,
                                        (BYTE *)CONCAT44(in_stack_fffffffffffff8bc,
                                                         in_stack_fffffffffffff8b8),
                                        (BYTE *)CONCAT44(in_stack_fffffffffffff8b4,
                                                         in_stack_fffffffffffff8b0),
                                        (size_t *)
                                        CONCAT44(in_stack_fffffffffffff8ac,in_stack_fffffffffffff8a8
                                                ));
                }
                else {
                  if (local_3d0 != 6) {
                    __assert_fail("0",
                                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                                  ,0x793c,
                                  "size_t ZSTD_searchMax(ZSTD_matchState_t *, const BYTE *, const BYTE *, size_t *, const U32, const U32, const searchMethod_e, const ZSTD_dictMode_e)"
                                 );
                  }
                  local_40 = ZSTD_RowFindBestMatch_dictMatchState_6_6
                                       (in_stack_fffffffffffff8c0,
                                        (BYTE *)CONCAT44(in_stack_fffffffffffff8bc,
                                                         in_stack_fffffffffffff8b8),
                                        (BYTE *)CONCAT44(in_stack_fffffffffffff8b4,
                                                         in_stack_fffffffffffff8b0),
                                        (size_t *)
                                        CONCAT44(in_stack_fffffffffffff8ac,in_stack_fffffffffffff8a8
                                                ));
                }
              }
            }
          }
          else {
            if (local_384 != 3) {
              __assert_fail("0",
                            "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                            ,0x7940,
                            "size_t ZSTD_searchMax(ZSTD_matchState_t *, const BYTE *, const BYTE *, size_t *, const U32, const U32, const searchMethod_e, const ZSTD_dictMode_e)"
                           );
            }
            if (local_37c == 0) {
              if (local_3cc == 4) {
                local_40 = ZSTD_HcFindBestMatch_dedicatedDictSearch_4
                                     (in_stack_fffffffffffff848,in_stack_fffffffffffff840,
                                      in_stack_fffffffffffff838,
                                      (size_t *)
                                      CONCAT44(in_stack_fffffffffffff834,in_stack_fffffffffffff830))
                ;
              }
              else if (local_3cc == 5) {
                local_40 = ZSTD_HcFindBestMatch_dedicatedDictSearch_5
                                     (in_stack_fffffffffffff848,in_stack_fffffffffffff840,
                                      in_stack_fffffffffffff838,
                                      (size_t *)
                                      CONCAT44(in_stack_fffffffffffff834,in_stack_fffffffffffff830))
                ;
              }
              else {
                if (local_3cc != 6) goto LAB_002557b0;
                local_40 = ZSTD_HcFindBestMatch_dedicatedDictSearch_6
                                     (in_stack_fffffffffffff848,in_stack_fffffffffffff840,
                                      in_stack_fffffffffffff838,
                                      (size_t *)
                                      CONCAT44(in_stack_fffffffffffff834,in_stack_fffffffffffff830))
                ;
              }
            }
            else if (local_37c == 1) {
              if (local_3cc == 4) {
                local_40 = ZSTD_BtFindBestMatch_dedicatedDictSearch_4
                                     ((ZSTD_matchState_t *)
                                      CONCAT44(in_stack_fffffffffffff7e4,in_stack_fffffffffffff7e0),
                                      in_stack_fffffffffffff7d8,
                                      (BYTE *)CONCAT44(in_stack_fffffffffffff7d4,
                                                       in_stack_fffffffffffff7d0),
                                      (size_t *)
                                      CONCAT44(in_stack_fffffffffffff7cc,in_stack_fffffffffffff7c8))
                ;
              }
              else if (local_3cc == 5) {
                local_40 = ZSTD_BtFindBestMatch_dedicatedDictSearch_5
                                     ((ZSTD_matchState_t *)
                                      CONCAT44(in_stack_fffffffffffff7e4,in_stack_fffffffffffff7e0),
                                      in_stack_fffffffffffff7d8,
                                      (BYTE *)CONCAT44(in_stack_fffffffffffff7d4,
                                                       in_stack_fffffffffffff7d0),
                                      (size_t *)
                                      CONCAT44(in_stack_fffffffffffff7cc,in_stack_fffffffffffff7c8))
                ;
              }
              else {
                if (local_3cc != 6) goto LAB_002557b0;
                local_40 = ZSTD_BtFindBestMatch_dedicatedDictSearch_6
                                     ((ZSTD_matchState_t *)
                                      CONCAT44(in_stack_fffffffffffff7e4,in_stack_fffffffffffff7e0),
                                      in_stack_fffffffffffff7d8,
                                      (BYTE *)CONCAT44(in_stack_fffffffffffff7d4,
                                                       in_stack_fffffffffffff7d0),
                                      (size_t *)
                                      CONCAT44(in_stack_fffffffffffff7cc,in_stack_fffffffffffff7c8))
                ;
              }
            }
            else {
              if (local_37c != 2) {
LAB_002557b0:
                __assert_fail("0",
                              "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                              ,0x793e,
                              "size_t ZSTD_searchMax(ZSTD_matchState_t *, const BYTE *, const BYTE *, size_t *, const U32, const U32, const searchMethod_e, const ZSTD_dictMode_e)"
                             );
              }
              if (local_3cc == 4) {
                if (local_3d0 == 4) {
                  local_40 = ZSTD_RowFindBestMatch_dedicatedDictSearch_4_4
                                       (in_stack_fffffffffffff8c0,
                                        (BYTE *)CONCAT44(in_stack_fffffffffffff8bc,
                                                         in_stack_fffffffffffff8b8),
                                        (BYTE *)CONCAT44(in_stack_fffffffffffff8b4,
                                                         in_stack_fffffffffffff8b0),
                                        (size_t *)
                                        CONCAT44(in_stack_fffffffffffff8ac,in_stack_fffffffffffff8a8
                                                ));
                }
                else if (local_3d0 == 5) {
                  local_40 = ZSTD_RowFindBestMatch_dedicatedDictSearch_4_5
                                       (in_stack_fffffffffffff8c0,
                                        (BYTE *)CONCAT44(in_stack_fffffffffffff8bc,
                                                         in_stack_fffffffffffff8b8),
                                        (BYTE *)CONCAT44(in_stack_fffffffffffff8b4,
                                                         in_stack_fffffffffffff8b0),
                                        (size_t *)
                                        CONCAT44(in_stack_fffffffffffff8ac,in_stack_fffffffffffff8a8
                                                ));
                }
                else {
                  if (local_3d0 != 6) {
                    __assert_fail("0",
                                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                                  ,0x793e,
                                  "size_t ZSTD_searchMax(ZSTD_matchState_t *, const BYTE *, const BYTE *, size_t *, const U32, const U32, const searchMethod_e, const ZSTD_dictMode_e)"
                                 );
                  }
                  local_40 = ZSTD_RowFindBestMatch_dedicatedDictSearch_4_6
                                       (in_stack_fffffffffffff8c0,
                                        (BYTE *)CONCAT44(in_stack_fffffffffffff8bc,
                                                         in_stack_fffffffffffff8b8),
                                        (BYTE *)CONCAT44(in_stack_fffffffffffff8b4,
                                                         in_stack_fffffffffffff8b0),
                                        (size_t *)
                                        CONCAT44(in_stack_fffffffffffff8ac,in_stack_fffffffffffff8a8
                                                ));
                }
              }
              else if (local_3cc == 5) {
                if (local_3d0 == 4) {
                  local_40 = ZSTD_RowFindBestMatch_dedicatedDictSearch_5_4
                                       (in_stack_fffffffffffff8c0,
                                        (BYTE *)CONCAT44(in_stack_fffffffffffff8bc,
                                                         in_stack_fffffffffffff8b8),
                                        (BYTE *)CONCAT44(in_stack_fffffffffffff8b4,
                                                         in_stack_fffffffffffff8b0),
                                        (size_t *)
                                        CONCAT44(in_stack_fffffffffffff8ac,in_stack_fffffffffffff8a8
                                                ));
                }
                else if (local_3d0 == 5) {
                  local_40 = ZSTD_RowFindBestMatch_dedicatedDictSearch_5_5
                                       (in_stack_fffffffffffff8c0,
                                        (BYTE *)CONCAT44(in_stack_fffffffffffff8bc,
                                                         in_stack_fffffffffffff8b8),
                                        (BYTE *)CONCAT44(in_stack_fffffffffffff8b4,
                                                         in_stack_fffffffffffff8b0),
                                        (size_t *)
                                        CONCAT44(in_stack_fffffffffffff8ac,in_stack_fffffffffffff8a8
                                                ));
                }
                else {
                  if (local_3d0 != 6) {
                    __assert_fail("0",
                                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                                  ,0x793e,
                                  "size_t ZSTD_searchMax(ZSTD_matchState_t *, const BYTE *, const BYTE *, size_t *, const U32, const U32, const searchMethod_e, const ZSTD_dictMode_e)"
                                 );
                  }
                  local_40 = ZSTD_RowFindBestMatch_dedicatedDictSearch_5_6
                                       (in_stack_fffffffffffff8c0,
                                        (BYTE *)CONCAT44(in_stack_fffffffffffff8bc,
                                                         in_stack_fffffffffffff8b8),
                                        (BYTE *)CONCAT44(in_stack_fffffffffffff8b4,
                                                         in_stack_fffffffffffff8b0),
                                        (size_t *)
                                        CONCAT44(in_stack_fffffffffffff8ac,in_stack_fffffffffffff8a8
                                                ));
                }
              }
              else {
                if (local_3cc != 6) goto LAB_002557b0;
                if (local_3d0 == 4) {
                  local_40 = ZSTD_RowFindBestMatch_dedicatedDictSearch_6_4
                                       (in_stack_fffffffffffff8c0,
                                        (BYTE *)CONCAT44(in_stack_fffffffffffff8bc,
                                                         in_stack_fffffffffffff8b8),
                                        (BYTE *)CONCAT44(in_stack_fffffffffffff8b4,
                                                         in_stack_fffffffffffff8b0),
                                        (size_t *)
                                        CONCAT44(in_stack_fffffffffffff8ac,in_stack_fffffffffffff8a8
                                                ));
                }
                else if (local_3d0 == 5) {
                  local_40 = ZSTD_RowFindBestMatch_dedicatedDictSearch_6_5
                                       (in_stack_fffffffffffff8c0,
                                        (BYTE *)CONCAT44(in_stack_fffffffffffff8bc,
                                                         in_stack_fffffffffffff8b8),
                                        (BYTE *)CONCAT44(in_stack_fffffffffffff8b4,
                                                         in_stack_fffffffffffff8b0),
                                        (size_t *)
                                        CONCAT44(in_stack_fffffffffffff8ac,in_stack_fffffffffffff8a8
                                                ));
                }
                else {
                  if (local_3d0 != 6) {
                    __assert_fail("0",
                                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                                  ,0x793e,
                                  "size_t ZSTD_searchMax(ZSTD_matchState_t *, const BYTE *, const BYTE *, size_t *, const U32, const U32, const searchMethod_e, const ZSTD_dictMode_e)"
                                 );
                  }
                  local_40 = ZSTD_RowFindBestMatch_dedicatedDictSearch_6_6
                                       (in_stack_fffffffffffff8c0,
                                        (BYTE *)CONCAT44(in_stack_fffffffffffff8bc,
                                                         in_stack_fffffffffffff8b8),
                                        (BYTE *)CONCAT44(in_stack_fffffffffffff8b4,
                                                         in_stack_fffffffffffff8b0),
                                        (size_t *)
                                        CONCAT44(in_stack_fffffffffffff8ac,in_stack_fffffffffffff8a8
                                                ));
                }
              }
            }
          }
          local_4c0 = local_40;
          lVar8 = local_40 << 2;
          uVar6 = ZSTD_highbit32(0);
          local_4c4 = (int)lVar8 - uVar6;
          lVar8 = local_438 << 2;
          uVar6 = ZSTD_highbit32(0);
          local_4c8 = ((int)lVar8 - uVar6) + 4;
          if ((local_4c0 < 4) || (local_4c4 <= local_4c8)) {
            if ((local_380 != 2) || (local_3b0 <= local_398)) break;
            local_398 = local_398 + 1;
            if ((local_384 == 0) && (local_440 != 0)) {
              bVar9 = local_3d4 != 0;
              UVar3 = MEM_read32(local_398);
              UVar4 = MEM_read32(local_398 + -(ulong)local_3d4);
              if (bVar9 && UVar3 == UVar4) {
                sVar7 = ZSTD_count((BYTE *)CONCAT44(in_stack_fffffffffffff7fc,
                                                    in_stack_fffffffffffff7f8),
                                   in_stack_fffffffffffff7f0,in_stack_fffffffffffff7e8);
                local_4d0 = sVar7 + 4;
                local_4d4 = (int)local_4d0 * 4;
                lVar8 = local_438 << 2;
                uVar6 = ZSTD_highbit32(0);
                local_4d8 = ((int)lVar8 - uVar6) + 1;
                if ((3 < local_4d0) && (local_4d8 < local_4d4)) {
                  local_438 = local_4d0;
                  local_440 = 1;
                  local_448 = local_398;
                }
              }
            }
            if (local_3ec != 0) {
              local_4dc = ((int)local_398 - (int)local_3b8) - local_3d4;
              if (local_4dc < local_3bc) {
                local_728 = (BYTE *)(local_408 + (ulong)(local_4dc - local_41c));
              }
              else {
                local_728 = local_3b8 + local_4dc;
              }
              local_4e8 = local_728;
              if (2 < (local_3bc - 1) - local_4dc) {
                UVar3 = MEM_read32(local_728);
                UVar4 = MEM_read32(local_398);
                if (UVar3 == UVar4) {
                  if (local_4dc < local_3bc) {
                    local_738 = local_418;
                  }
                  else {
                    local_738 = local_3a8;
                  }
                  local_4f0 = local_738;
                  sVar7 = ZSTD_count_2segments
                                    ((BYTE *)CONCAT44(in_stack_fffffffffffff7fc,
                                                      in_stack_fffffffffffff7f8),
                                     in_stack_fffffffffffff7f0,in_stack_fffffffffffff7e8,
                                     (BYTE *)CONCAT44(in_stack_fffffffffffff7e4,
                                                      in_stack_fffffffffffff7e0),
                                     in_stack_fffffffffffff7d8);
                  local_4f8 = sVar7 + 4;
                  local_4fc = (int)local_4f8 * 4;
                  in_stack_fffffffffffff8c0 = (ZSTD_matchState_t *)(local_438 << 2);
                  uVar6 = ZSTD_highbit32(0);
                  local_500 = ((int)in_stack_fffffffffffff8c0 - uVar6) + 1;
                  if ((3 < local_4f8) && (local_500 < local_4fc)) {
                    local_438 = local_4f8;
                    local_440 = 1;
                    local_448 = local_398;
                  }
                }
              }
            }
            local_508 = 999999999;
            local_80 = local_358;
            local_88 = local_398;
            local_90 = local_3a8;
            local_98 = &local_508;
            local_9c = local_3cc;
            local_a0 = local_3d0;
            local_a4 = local_37c;
            local_a8 = local_384;
            if (local_384 == 0) {
              in_stack_fffffffffffff8bc = local_37c;
              if (local_37c == 0) {
                in_stack_fffffffffffff8b8 = local_3cc;
                if (local_3cc == 4) {
                  local_78 = ZSTD_HcFindBestMatch_noDict_4
                                       (in_stack_fffffffffffff848,in_stack_fffffffffffff840,
                                        in_stack_fffffffffffff838,
                                        (size_t *)
                                        CONCAT44(in_stack_fffffffffffff834,in_stack_fffffffffffff830
                                                ));
                }
                else if (local_3cc == 5) {
                  local_78 = ZSTD_HcFindBestMatch_noDict_5
                                       (in_stack_fffffffffffff848,in_stack_fffffffffffff840,
                                        in_stack_fffffffffffff838,
                                        (size_t *)
                                        CONCAT44(in_stack_fffffffffffff834,in_stack_fffffffffffff830
                                                ));
                }
                else {
                  if (local_3cc != 6) goto LAB_002561bf;
                  local_78 = ZSTD_HcFindBestMatch_noDict_6
                                       (in_stack_fffffffffffff848,in_stack_fffffffffffff840,
                                        in_stack_fffffffffffff838,
                                        (size_t *)
                                        CONCAT44(in_stack_fffffffffffff834,in_stack_fffffffffffff830
                                                ));
                }
              }
              else if (local_37c == 1) {
                in_stack_fffffffffffff8b4 = local_3cc;
                if (local_3cc == 4) {
                  local_78 = ZSTD_BtFindBestMatch_noDict_4
                                       ((ZSTD_matchState_t *)
                                        CONCAT44(in_stack_fffffffffffff7e4,in_stack_fffffffffffff7e0
                                                ),in_stack_fffffffffffff7d8,
                                        (BYTE *)CONCAT44(in_stack_fffffffffffff7d4,
                                                         in_stack_fffffffffffff7d0),
                                        (size_t *)
                                        CONCAT44(in_stack_fffffffffffff7cc,in_stack_fffffffffffff7c8
                                                ));
                }
                else if (local_3cc == 5) {
                  local_78 = ZSTD_BtFindBestMatch_noDict_5
                                       ((ZSTD_matchState_t *)
                                        CONCAT44(in_stack_fffffffffffff7e4,in_stack_fffffffffffff7e0
                                                ),in_stack_fffffffffffff7d8,
                                        (BYTE *)CONCAT44(in_stack_fffffffffffff7d4,
                                                         in_stack_fffffffffffff7d0),
                                        (size_t *)
                                        CONCAT44(in_stack_fffffffffffff7cc,in_stack_fffffffffffff7c8
                                                ));
                }
                else {
                  if (local_3cc != 6) goto LAB_002561bf;
                  local_78 = ZSTD_BtFindBestMatch_noDict_6
                                       ((ZSTD_matchState_t *)
                                        CONCAT44(in_stack_fffffffffffff7e4,in_stack_fffffffffffff7e0
                                                ),in_stack_fffffffffffff7d8,
                                        (BYTE *)CONCAT44(in_stack_fffffffffffff7d4,
                                                         in_stack_fffffffffffff7d0),
                                        (size_t *)
                                        CONCAT44(in_stack_fffffffffffff7cc,in_stack_fffffffffffff7c8
                                                ));
                }
              }
              else {
                if (local_37c != 2) {
LAB_002561bf:
                  __assert_fail("0",
                                "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                                ,0x7938,
                                "size_t ZSTD_searchMax(ZSTD_matchState_t *, const BYTE *, const BYTE *, size_t *, const U32, const U32, const searchMethod_e, const ZSTD_dictMode_e)"
                               );
                }
                in_stack_fffffffffffff8b0 = local_3cc;
                if (local_3cc == 4) {
                  in_stack_fffffffffffff8ac = local_3d0;
                  if (local_3d0 == 4) {
                    local_78 = ZSTD_RowFindBestMatch_noDict_4_4
                                         (in_stack_fffffffffffff8c0,
                                          (BYTE *)CONCAT44(2,in_stack_fffffffffffff8b8),
                                          (BYTE *)CONCAT44(in_stack_fffffffffffff8b4,4),
                                          (size_t *)CONCAT44(4,in_stack_fffffffffffff8a8));
                  }
                  else if (local_3d0 == 5) {
                    local_78 = ZSTD_RowFindBestMatch_noDict_4_5
                                         (in_stack_fffffffffffff8c0,
                                          (BYTE *)CONCAT44(2,in_stack_fffffffffffff8b8),
                                          (BYTE *)CONCAT44(in_stack_fffffffffffff8b4,4),
                                          (size_t *)CONCAT44(5,in_stack_fffffffffffff8a8));
                  }
                  else {
                    if (local_3d0 != 6) {
                      __assert_fail("0",
                                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                                    ,0x7938,
                                    "size_t ZSTD_searchMax(ZSTD_matchState_t *, const BYTE *, const BYTE *, size_t *, const U32, const U32, const searchMethod_e, const ZSTD_dictMode_e)"
                                   );
                    }
                    local_78 = ZSTD_RowFindBestMatch_noDict_4_6
                                         (in_stack_fffffffffffff8c0,
                                          (BYTE *)CONCAT44(2,in_stack_fffffffffffff8b8),
                                          (BYTE *)CONCAT44(in_stack_fffffffffffff8b4,4),
                                          (size_t *)CONCAT44(6,in_stack_fffffffffffff8a8));
                  }
                }
                else if (local_3cc == 5) {
                  in_stack_fffffffffffff8a8 = local_3d0;
                  if (local_3d0 == 4) {
                    local_78 = ZSTD_RowFindBestMatch_noDict_5_4
                                         (in_stack_fffffffffffff8c0,
                                          (BYTE *)CONCAT44(2,in_stack_fffffffffffff8b8),
                                          (BYTE *)CONCAT44(in_stack_fffffffffffff8b4,5),
                                          (size_t *)CONCAT44(in_stack_fffffffffffff8ac,4));
                  }
                  else if (local_3d0 == 5) {
                    local_78 = ZSTD_RowFindBestMatch_noDict_5_5
                                         (in_stack_fffffffffffff8c0,
                                          (BYTE *)CONCAT44(2,in_stack_fffffffffffff8b8),
                                          (BYTE *)CONCAT44(in_stack_fffffffffffff8b4,5),
                                          (size_t *)CONCAT44(in_stack_fffffffffffff8ac,5));
                  }
                  else {
                    if (local_3d0 != 6) {
                      __assert_fail("0",
                                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                                    ,0x7938,
                                    "size_t ZSTD_searchMax(ZSTD_matchState_t *, const BYTE *, const BYTE *, size_t *, const U32, const U32, const searchMethod_e, const ZSTD_dictMode_e)"
                                   );
                    }
                    local_78 = ZSTD_RowFindBestMatch_noDict_5_6
                                         (in_stack_fffffffffffff8c0,
                                          (BYTE *)CONCAT44(2,in_stack_fffffffffffff8b8),
                                          (BYTE *)CONCAT44(in_stack_fffffffffffff8b4,5),
                                          (size_t *)CONCAT44(in_stack_fffffffffffff8ac,6));
                  }
                }
                else {
                  if (local_3cc != 6) goto LAB_002561bf;
                  if (local_3d0 == 4) {
                    local_78 = ZSTD_RowFindBestMatch_noDict_6_4
                                         (in_stack_fffffffffffff8c0,
                                          (BYTE *)CONCAT44(2,in_stack_fffffffffffff8b8),
                                          (BYTE *)CONCAT44(in_stack_fffffffffffff8b4,6),
                                          (size_t *)
                                          CONCAT44(in_stack_fffffffffffff8ac,
                                                   in_stack_fffffffffffff8a8));
                  }
                  else if (local_3d0 == 5) {
                    local_78 = ZSTD_RowFindBestMatch_noDict_6_5
                                         (in_stack_fffffffffffff8c0,
                                          (BYTE *)CONCAT44(2,in_stack_fffffffffffff8b8),
                                          (BYTE *)CONCAT44(in_stack_fffffffffffff8b4,6),
                                          (size_t *)
                                          CONCAT44(in_stack_fffffffffffff8ac,
                                                   in_stack_fffffffffffff8a8));
                  }
                  else {
                    if (local_3d0 != 6) {
                      __assert_fail("0",
                                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                                    ,0x7938,
                                    "size_t ZSTD_searchMax(ZSTD_matchState_t *, const BYTE *, const BYTE *, size_t *, const U32, const U32, const searchMethod_e, const ZSTD_dictMode_e)"
                                   );
                    }
                    local_78 = ZSTD_RowFindBestMatch_noDict_6_6
                                         (in_stack_fffffffffffff8c0,
                                          (BYTE *)CONCAT44(2,in_stack_fffffffffffff8b8),
                                          (BYTE *)CONCAT44(in_stack_fffffffffffff8b4,6),
                                          (size_t *)
                                          CONCAT44(in_stack_fffffffffffff8ac,
                                                   in_stack_fffffffffffff8a8));
                  }
                }
              }
            }
            else if (local_384 == 1) {
              if (local_37c == 0) {
                if (local_3cc == 4) {
                  local_78 = ZSTD_HcFindBestMatch_extDict_4
                                       (in_stack_fffffffffffff848,in_stack_fffffffffffff840,
                                        in_stack_fffffffffffff838,
                                        (size_t *)
                                        CONCAT44(in_stack_fffffffffffff834,in_stack_fffffffffffff830
                                                ));
                }
                else if (local_3cc == 5) {
                  local_78 = ZSTD_HcFindBestMatch_extDict_5
                                       (in_stack_fffffffffffff848,in_stack_fffffffffffff840,
                                        in_stack_fffffffffffff838,
                                        (size_t *)
                                        CONCAT44(in_stack_fffffffffffff834,in_stack_fffffffffffff830
                                                ));
                }
                else {
                  if (local_3cc != 6) goto LAB_002566be;
                  local_78 = ZSTD_HcFindBestMatch_extDict_6
                                       (in_stack_fffffffffffff848,in_stack_fffffffffffff840,
                                        in_stack_fffffffffffff838,
                                        (size_t *)
                                        CONCAT44(in_stack_fffffffffffff834,in_stack_fffffffffffff830
                                                ));
                }
              }
              else if (local_37c == 1) {
                if (local_3cc == 4) {
                  local_78 = ZSTD_BtFindBestMatch_extDict_4
                                       ((ZSTD_matchState_t *)
                                        CONCAT44(in_stack_fffffffffffff7e4,in_stack_fffffffffffff7e0
                                                ),in_stack_fffffffffffff7d8,
                                        (BYTE *)CONCAT44(in_stack_fffffffffffff7d4,
                                                         in_stack_fffffffffffff7d0),
                                        (size_t *)
                                        CONCAT44(in_stack_fffffffffffff7cc,in_stack_fffffffffffff7c8
                                                ));
                }
                else if (local_3cc == 5) {
                  local_78 = ZSTD_BtFindBestMatch_extDict_5
                                       ((ZSTD_matchState_t *)
                                        CONCAT44(in_stack_fffffffffffff7e4,in_stack_fffffffffffff7e0
                                                ),in_stack_fffffffffffff7d8,
                                        (BYTE *)CONCAT44(in_stack_fffffffffffff7d4,
                                                         in_stack_fffffffffffff7d0),
                                        (size_t *)
                                        CONCAT44(in_stack_fffffffffffff7cc,in_stack_fffffffffffff7c8
                                                ));
                }
                else {
                  if (local_3cc != 6) goto LAB_002566be;
                  local_78 = ZSTD_BtFindBestMatch_extDict_6
                                       ((ZSTD_matchState_t *)
                                        CONCAT44(in_stack_fffffffffffff7e4,in_stack_fffffffffffff7e0
                                                ),in_stack_fffffffffffff7d8,
                                        (BYTE *)CONCAT44(in_stack_fffffffffffff7d4,
                                                         in_stack_fffffffffffff7d0),
                                        (size_t *)
                                        CONCAT44(in_stack_fffffffffffff7cc,in_stack_fffffffffffff7c8
                                                ));
                }
              }
              else {
                if (local_37c != 2) {
LAB_002566be:
                  __assert_fail("0",
                                "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                                ,0x793a,
                                "size_t ZSTD_searchMax(ZSTD_matchState_t *, const BYTE *, const BYTE *, size_t *, const U32, const U32, const searchMethod_e, const ZSTD_dictMode_e)"
                               );
                }
                if (local_3cc == 4) {
                  if (local_3d0 == 4) {
                    local_78 = ZSTD_RowFindBestMatch_extDict_4_4
                                         (in_stack_fffffffffffff8c0,
                                          (BYTE *)CONCAT44(in_stack_fffffffffffff8bc,
                                                           in_stack_fffffffffffff8b8),
                                          (BYTE *)CONCAT44(in_stack_fffffffffffff8b4,
                                                           in_stack_fffffffffffff8b0),
                                          (size_t *)
                                          CONCAT44(in_stack_fffffffffffff8ac,
                                                   in_stack_fffffffffffff8a8));
                  }
                  else if (local_3d0 == 5) {
                    local_78 = ZSTD_RowFindBestMatch_extDict_4_5
                                         (in_stack_fffffffffffff8c0,
                                          (BYTE *)CONCAT44(in_stack_fffffffffffff8bc,
                                                           in_stack_fffffffffffff8b8),
                                          (BYTE *)CONCAT44(in_stack_fffffffffffff8b4,
                                                           in_stack_fffffffffffff8b0),
                                          (size_t *)
                                          CONCAT44(in_stack_fffffffffffff8ac,
                                                   in_stack_fffffffffffff8a8));
                  }
                  else {
                    if (local_3d0 != 6) {
                      __assert_fail("0",
                                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                                    ,0x793a,
                                    "size_t ZSTD_searchMax(ZSTD_matchState_t *, const BYTE *, const BYTE *, size_t *, const U32, const U32, const searchMethod_e, const ZSTD_dictMode_e)"
                                   );
                    }
                    local_78 = ZSTD_RowFindBestMatch_extDict_4_6
                                         (in_stack_fffffffffffff8c0,
                                          (BYTE *)CONCAT44(in_stack_fffffffffffff8bc,
                                                           in_stack_fffffffffffff8b8),
                                          (BYTE *)CONCAT44(in_stack_fffffffffffff8b4,
                                                           in_stack_fffffffffffff8b0),
                                          (size_t *)
                                          CONCAT44(in_stack_fffffffffffff8ac,
                                                   in_stack_fffffffffffff8a8));
                  }
                }
                else if (local_3cc == 5) {
                  if (local_3d0 == 4) {
                    local_78 = ZSTD_RowFindBestMatch_extDict_5_4
                                         (in_stack_fffffffffffff8c0,
                                          (BYTE *)CONCAT44(in_stack_fffffffffffff8bc,
                                                           in_stack_fffffffffffff8b8),
                                          (BYTE *)CONCAT44(in_stack_fffffffffffff8b4,
                                                           in_stack_fffffffffffff8b0),
                                          (size_t *)
                                          CONCAT44(in_stack_fffffffffffff8ac,
                                                   in_stack_fffffffffffff8a8));
                  }
                  else if (local_3d0 == 5) {
                    local_78 = ZSTD_RowFindBestMatch_extDict_5_5
                                         (in_stack_fffffffffffff8c0,
                                          (BYTE *)CONCAT44(in_stack_fffffffffffff8bc,
                                                           in_stack_fffffffffffff8b8),
                                          (BYTE *)CONCAT44(in_stack_fffffffffffff8b4,
                                                           in_stack_fffffffffffff8b0),
                                          (size_t *)
                                          CONCAT44(in_stack_fffffffffffff8ac,
                                                   in_stack_fffffffffffff8a8));
                  }
                  else {
                    if (local_3d0 != 6) {
                      __assert_fail("0",
                                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                                    ,0x793a,
                                    "size_t ZSTD_searchMax(ZSTD_matchState_t *, const BYTE *, const BYTE *, size_t *, const U32, const U32, const searchMethod_e, const ZSTD_dictMode_e)"
                                   );
                    }
                    local_78 = ZSTD_RowFindBestMatch_extDict_5_6
                                         (in_stack_fffffffffffff8c0,
                                          (BYTE *)CONCAT44(in_stack_fffffffffffff8bc,
                                                           in_stack_fffffffffffff8b8),
                                          (BYTE *)CONCAT44(in_stack_fffffffffffff8b4,
                                                           in_stack_fffffffffffff8b0),
                                          (size_t *)
                                          CONCAT44(in_stack_fffffffffffff8ac,
                                                   in_stack_fffffffffffff8a8));
                  }
                }
                else {
                  if (local_3cc != 6) goto LAB_002566be;
                  if (local_3d0 == 4) {
                    local_78 = ZSTD_RowFindBestMatch_extDict_6_4
                                         (in_stack_fffffffffffff8c0,
                                          (BYTE *)CONCAT44(in_stack_fffffffffffff8bc,
                                                           in_stack_fffffffffffff8b8),
                                          (BYTE *)CONCAT44(in_stack_fffffffffffff8b4,
                                                           in_stack_fffffffffffff8b0),
                                          (size_t *)
                                          CONCAT44(in_stack_fffffffffffff8ac,
                                                   in_stack_fffffffffffff8a8));
                  }
                  else if (local_3d0 == 5) {
                    local_78 = ZSTD_RowFindBestMatch_extDict_6_5
                                         (in_stack_fffffffffffff8c0,
                                          (BYTE *)CONCAT44(in_stack_fffffffffffff8bc,
                                                           in_stack_fffffffffffff8b8),
                                          (BYTE *)CONCAT44(in_stack_fffffffffffff8b4,
                                                           in_stack_fffffffffffff8b0),
                                          (size_t *)
                                          CONCAT44(in_stack_fffffffffffff8ac,
                                                   in_stack_fffffffffffff8a8));
                  }
                  else {
                    if (local_3d0 != 6) {
                      __assert_fail("0",
                                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                                    ,0x793a,
                                    "size_t ZSTD_searchMax(ZSTD_matchState_t *, const BYTE *, const BYTE *, size_t *, const U32, const U32, const searchMethod_e, const ZSTD_dictMode_e)"
                                   );
                    }
                    local_78 = ZSTD_RowFindBestMatch_extDict_6_6
                                         (in_stack_fffffffffffff8c0,
                                          (BYTE *)CONCAT44(in_stack_fffffffffffff8bc,
                                                           in_stack_fffffffffffff8b8),
                                          (BYTE *)CONCAT44(in_stack_fffffffffffff8b4,
                                                           in_stack_fffffffffffff8b0),
                                          (size_t *)
                                          CONCAT44(in_stack_fffffffffffff8ac,
                                                   in_stack_fffffffffffff8a8));
                  }
                }
              }
            }
            else if (local_384 == 2) {
              if (local_37c == 0) {
                if (local_3cc == 4) {
                  local_78 = ZSTD_HcFindBestMatch_dictMatchState_4
                                       (in_stack_fffffffffffff848,in_stack_fffffffffffff840,
                                        in_stack_fffffffffffff838,
                                        (size_t *)
                                        CONCAT44(in_stack_fffffffffffff834,in_stack_fffffffffffff830
                                                ));
                }
                else if (local_3cc == 5) {
                  local_78 = ZSTD_HcFindBestMatch_dictMatchState_5
                                       (in_stack_fffffffffffff848,in_stack_fffffffffffff840,
                                        in_stack_fffffffffffff838,
                                        (size_t *)
                                        CONCAT44(in_stack_fffffffffffff834,in_stack_fffffffffffff830
                                                ));
                }
                else {
                  if (local_3cc != 6) goto LAB_00256bbd;
                  local_78 = ZSTD_HcFindBestMatch_dictMatchState_6
                                       (in_stack_fffffffffffff848,in_stack_fffffffffffff840,
                                        in_stack_fffffffffffff838,
                                        (size_t *)
                                        CONCAT44(in_stack_fffffffffffff834,in_stack_fffffffffffff830
                                                ));
                }
              }
              else if (local_37c == 1) {
                if (local_3cc == 4) {
                  local_78 = ZSTD_BtFindBestMatch_dictMatchState_4
                                       ((ZSTD_matchState_t *)
                                        CONCAT44(in_stack_fffffffffffff7e4,in_stack_fffffffffffff7e0
                                                ),in_stack_fffffffffffff7d8,
                                        (BYTE *)CONCAT44(in_stack_fffffffffffff7d4,
                                                         in_stack_fffffffffffff7d0),
                                        (size_t *)
                                        CONCAT44(in_stack_fffffffffffff7cc,in_stack_fffffffffffff7c8
                                                ));
                }
                else if (local_3cc == 5) {
                  local_78 = ZSTD_BtFindBestMatch_dictMatchState_5
                                       ((ZSTD_matchState_t *)
                                        CONCAT44(in_stack_fffffffffffff7e4,in_stack_fffffffffffff7e0
                                                ),in_stack_fffffffffffff7d8,
                                        (BYTE *)CONCAT44(in_stack_fffffffffffff7d4,
                                                         in_stack_fffffffffffff7d0),
                                        (size_t *)
                                        CONCAT44(in_stack_fffffffffffff7cc,in_stack_fffffffffffff7c8
                                                ));
                }
                else {
                  if (local_3cc != 6) goto LAB_00256bbd;
                  local_78 = ZSTD_BtFindBestMatch_dictMatchState_6
                                       ((ZSTD_matchState_t *)
                                        CONCAT44(in_stack_fffffffffffff7e4,in_stack_fffffffffffff7e0
                                                ),in_stack_fffffffffffff7d8,
                                        (BYTE *)CONCAT44(in_stack_fffffffffffff7d4,
                                                         in_stack_fffffffffffff7d0),
                                        (size_t *)
                                        CONCAT44(in_stack_fffffffffffff7cc,in_stack_fffffffffffff7c8
                                                ));
                }
              }
              else {
                if (local_37c != 2) {
LAB_00256bbd:
                  __assert_fail("0",
                                "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                                ,0x793c,
                                "size_t ZSTD_searchMax(ZSTD_matchState_t *, const BYTE *, const BYTE *, size_t *, const U32, const U32, const searchMethod_e, const ZSTD_dictMode_e)"
                               );
                }
                if (local_3cc == 4) {
                  if (local_3d0 == 4) {
                    local_78 = ZSTD_RowFindBestMatch_dictMatchState_4_4
                                         (in_stack_fffffffffffff8c0,
                                          (BYTE *)CONCAT44(in_stack_fffffffffffff8bc,
                                                           in_stack_fffffffffffff8b8),
                                          (BYTE *)CONCAT44(in_stack_fffffffffffff8b4,
                                                           in_stack_fffffffffffff8b0),
                                          (size_t *)
                                          CONCAT44(in_stack_fffffffffffff8ac,
                                                   in_stack_fffffffffffff8a8));
                  }
                  else if (local_3d0 == 5) {
                    local_78 = ZSTD_RowFindBestMatch_dictMatchState_4_5
                                         (in_stack_fffffffffffff8c0,
                                          (BYTE *)CONCAT44(in_stack_fffffffffffff8bc,
                                                           in_stack_fffffffffffff8b8),
                                          (BYTE *)CONCAT44(in_stack_fffffffffffff8b4,
                                                           in_stack_fffffffffffff8b0),
                                          (size_t *)
                                          CONCAT44(in_stack_fffffffffffff8ac,
                                                   in_stack_fffffffffffff8a8));
                  }
                  else {
                    if (local_3d0 != 6) {
                      __assert_fail("0",
                                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                                    ,0x793c,
                                    "size_t ZSTD_searchMax(ZSTD_matchState_t *, const BYTE *, const BYTE *, size_t *, const U32, const U32, const searchMethod_e, const ZSTD_dictMode_e)"
                                   );
                    }
                    local_78 = ZSTD_RowFindBestMatch_dictMatchState_4_6
                                         (in_stack_fffffffffffff8c0,
                                          (BYTE *)CONCAT44(in_stack_fffffffffffff8bc,
                                                           in_stack_fffffffffffff8b8),
                                          (BYTE *)CONCAT44(in_stack_fffffffffffff8b4,
                                                           in_stack_fffffffffffff8b0),
                                          (size_t *)
                                          CONCAT44(in_stack_fffffffffffff8ac,
                                                   in_stack_fffffffffffff8a8));
                  }
                }
                else if (local_3cc == 5) {
                  if (local_3d0 == 4) {
                    local_78 = ZSTD_RowFindBestMatch_dictMatchState_5_4
                                         (in_stack_fffffffffffff8c0,
                                          (BYTE *)CONCAT44(in_stack_fffffffffffff8bc,
                                                           in_stack_fffffffffffff8b8),
                                          (BYTE *)CONCAT44(in_stack_fffffffffffff8b4,
                                                           in_stack_fffffffffffff8b0),
                                          (size_t *)
                                          CONCAT44(in_stack_fffffffffffff8ac,
                                                   in_stack_fffffffffffff8a8));
                  }
                  else if (local_3d0 == 5) {
                    local_78 = ZSTD_RowFindBestMatch_dictMatchState_5_5
                                         (in_stack_fffffffffffff8c0,
                                          (BYTE *)CONCAT44(in_stack_fffffffffffff8bc,
                                                           in_stack_fffffffffffff8b8),
                                          (BYTE *)CONCAT44(in_stack_fffffffffffff8b4,
                                                           in_stack_fffffffffffff8b0),
                                          (size_t *)
                                          CONCAT44(in_stack_fffffffffffff8ac,
                                                   in_stack_fffffffffffff8a8));
                  }
                  else {
                    if (local_3d0 != 6) {
                      __assert_fail("0",
                                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                                    ,0x793c,
                                    "size_t ZSTD_searchMax(ZSTD_matchState_t *, const BYTE *, const BYTE *, size_t *, const U32, const U32, const searchMethod_e, const ZSTD_dictMode_e)"
                                   );
                    }
                    local_78 = ZSTD_RowFindBestMatch_dictMatchState_5_6
                                         (in_stack_fffffffffffff8c0,
                                          (BYTE *)CONCAT44(in_stack_fffffffffffff8bc,
                                                           in_stack_fffffffffffff8b8),
                                          (BYTE *)CONCAT44(in_stack_fffffffffffff8b4,
                                                           in_stack_fffffffffffff8b0),
                                          (size_t *)
                                          CONCAT44(in_stack_fffffffffffff8ac,
                                                   in_stack_fffffffffffff8a8));
                  }
                }
                else {
                  if (local_3cc != 6) goto LAB_00256bbd;
                  if (local_3d0 == 4) {
                    local_78 = ZSTD_RowFindBestMatch_dictMatchState_6_4
                                         (in_stack_fffffffffffff8c0,
                                          (BYTE *)CONCAT44(in_stack_fffffffffffff8bc,
                                                           in_stack_fffffffffffff8b8),
                                          (BYTE *)CONCAT44(in_stack_fffffffffffff8b4,
                                                           in_stack_fffffffffffff8b0),
                                          (size_t *)
                                          CONCAT44(in_stack_fffffffffffff8ac,
                                                   in_stack_fffffffffffff8a8));
                  }
                  else if (local_3d0 == 5) {
                    local_78 = ZSTD_RowFindBestMatch_dictMatchState_6_5
                                         (in_stack_fffffffffffff8c0,
                                          (BYTE *)CONCAT44(in_stack_fffffffffffff8bc,
                                                           in_stack_fffffffffffff8b8),
                                          (BYTE *)CONCAT44(in_stack_fffffffffffff8b4,
                                                           in_stack_fffffffffffff8b0),
                                          (size_t *)
                                          CONCAT44(in_stack_fffffffffffff8ac,
                                                   in_stack_fffffffffffff8a8));
                  }
                  else {
                    if (local_3d0 != 6) {
                      __assert_fail("0",
                                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                                    ,0x793c,
                                    "size_t ZSTD_searchMax(ZSTD_matchState_t *, const BYTE *, const BYTE *, size_t *, const U32, const U32, const searchMethod_e, const ZSTD_dictMode_e)"
                                   );
                    }
                    local_78 = ZSTD_RowFindBestMatch_dictMatchState_6_6
                                         (in_stack_fffffffffffff8c0,
                                          (BYTE *)CONCAT44(in_stack_fffffffffffff8bc,
                                                           in_stack_fffffffffffff8b8),
                                          (BYTE *)CONCAT44(in_stack_fffffffffffff8b4,
                                                           in_stack_fffffffffffff8b0),
                                          (size_t *)
                                          CONCAT44(in_stack_fffffffffffff8ac,
                                                   in_stack_fffffffffffff8a8));
                  }
                }
              }
            }
            else {
              if (local_384 != 3) {
                __assert_fail("0",
                              "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                              ,0x7940,
                              "size_t ZSTD_searchMax(ZSTD_matchState_t *, const BYTE *, const BYTE *, size_t *, const U32, const U32, const searchMethod_e, const ZSTD_dictMode_e)"
                             );
              }
              if (local_37c == 0) {
                if (local_3cc == 4) {
                  local_78 = ZSTD_HcFindBestMatch_dedicatedDictSearch_4
                                       (in_stack_fffffffffffff848,in_stack_fffffffffffff840,
                                        in_stack_fffffffffffff838,
                                        (size_t *)
                                        CONCAT44(in_stack_fffffffffffff834,in_stack_fffffffffffff830
                                                ));
                }
                else if (local_3cc == 5) {
                  local_78 = ZSTD_HcFindBestMatch_dedicatedDictSearch_5
                                       (in_stack_fffffffffffff848,in_stack_fffffffffffff840,
                                        in_stack_fffffffffffff838,
                                        (size_t *)
                                        CONCAT44(in_stack_fffffffffffff834,in_stack_fffffffffffff830
                                                ));
                }
                else {
                  if (local_3cc != 6) goto LAB_002570b9;
                  local_78 = ZSTD_HcFindBestMatch_dedicatedDictSearch_6
                                       (in_stack_fffffffffffff848,in_stack_fffffffffffff840,
                                        in_stack_fffffffffffff838,
                                        (size_t *)
                                        CONCAT44(in_stack_fffffffffffff834,in_stack_fffffffffffff830
                                                ));
                }
              }
              else if (local_37c == 1) {
                if (local_3cc == 4) {
                  local_78 = ZSTD_BtFindBestMatch_dedicatedDictSearch_4
                                       ((ZSTD_matchState_t *)
                                        CONCAT44(in_stack_fffffffffffff7e4,in_stack_fffffffffffff7e0
                                                ),in_stack_fffffffffffff7d8,
                                        (BYTE *)CONCAT44(in_stack_fffffffffffff7d4,
                                                         in_stack_fffffffffffff7d0),
                                        (size_t *)
                                        CONCAT44(in_stack_fffffffffffff7cc,in_stack_fffffffffffff7c8
                                                ));
                }
                else if (local_3cc == 5) {
                  local_78 = ZSTD_BtFindBestMatch_dedicatedDictSearch_5
                                       ((ZSTD_matchState_t *)
                                        CONCAT44(in_stack_fffffffffffff7e4,in_stack_fffffffffffff7e0
                                                ),in_stack_fffffffffffff7d8,
                                        (BYTE *)CONCAT44(in_stack_fffffffffffff7d4,
                                                         in_stack_fffffffffffff7d0),
                                        (size_t *)
                                        CONCAT44(in_stack_fffffffffffff7cc,in_stack_fffffffffffff7c8
                                                ));
                }
                else {
                  if (local_3cc != 6) goto LAB_002570b9;
                  local_78 = ZSTD_BtFindBestMatch_dedicatedDictSearch_6
                                       ((ZSTD_matchState_t *)
                                        CONCAT44(in_stack_fffffffffffff7e4,in_stack_fffffffffffff7e0
                                                ),in_stack_fffffffffffff7d8,
                                        (BYTE *)CONCAT44(in_stack_fffffffffffff7d4,
                                                         in_stack_fffffffffffff7d0),
                                        (size_t *)
                                        CONCAT44(in_stack_fffffffffffff7cc,in_stack_fffffffffffff7c8
                                                ));
                }
              }
              else {
                if (local_37c != 2) {
LAB_002570b9:
                  __assert_fail("0",
                                "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                                ,0x793e,
                                "size_t ZSTD_searchMax(ZSTD_matchState_t *, const BYTE *, const BYTE *, size_t *, const U32, const U32, const searchMethod_e, const ZSTD_dictMode_e)"
                               );
                }
                if (local_3cc == 4) {
                  if (local_3d0 == 4) {
                    local_78 = ZSTD_RowFindBestMatch_dedicatedDictSearch_4_4
                                         (in_stack_fffffffffffff8c0,
                                          (BYTE *)CONCAT44(in_stack_fffffffffffff8bc,
                                                           in_stack_fffffffffffff8b8),
                                          (BYTE *)CONCAT44(in_stack_fffffffffffff8b4,
                                                           in_stack_fffffffffffff8b0),
                                          (size_t *)
                                          CONCAT44(in_stack_fffffffffffff8ac,
                                                   in_stack_fffffffffffff8a8));
                  }
                  else if (local_3d0 == 5) {
                    local_78 = ZSTD_RowFindBestMatch_dedicatedDictSearch_4_5
                                         (in_stack_fffffffffffff8c0,
                                          (BYTE *)CONCAT44(in_stack_fffffffffffff8bc,
                                                           in_stack_fffffffffffff8b8),
                                          (BYTE *)CONCAT44(in_stack_fffffffffffff8b4,
                                                           in_stack_fffffffffffff8b0),
                                          (size_t *)
                                          CONCAT44(in_stack_fffffffffffff8ac,
                                                   in_stack_fffffffffffff8a8));
                  }
                  else {
                    if (local_3d0 != 6) {
                      __assert_fail("0",
                                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                                    ,0x793e,
                                    "size_t ZSTD_searchMax(ZSTD_matchState_t *, const BYTE *, const BYTE *, size_t *, const U32, const U32, const searchMethod_e, const ZSTD_dictMode_e)"
                                   );
                    }
                    local_78 = ZSTD_RowFindBestMatch_dedicatedDictSearch_4_6
                                         (in_stack_fffffffffffff8c0,
                                          (BYTE *)CONCAT44(in_stack_fffffffffffff8bc,
                                                           in_stack_fffffffffffff8b8),
                                          (BYTE *)CONCAT44(in_stack_fffffffffffff8b4,
                                                           in_stack_fffffffffffff8b0),
                                          (size_t *)
                                          CONCAT44(in_stack_fffffffffffff8ac,
                                                   in_stack_fffffffffffff8a8));
                  }
                }
                else if (local_3cc == 5) {
                  if (local_3d0 == 4) {
                    local_78 = ZSTD_RowFindBestMatch_dedicatedDictSearch_5_4
                                         (in_stack_fffffffffffff8c0,
                                          (BYTE *)CONCAT44(in_stack_fffffffffffff8bc,
                                                           in_stack_fffffffffffff8b8),
                                          (BYTE *)CONCAT44(in_stack_fffffffffffff8b4,
                                                           in_stack_fffffffffffff8b0),
                                          (size_t *)
                                          CONCAT44(in_stack_fffffffffffff8ac,
                                                   in_stack_fffffffffffff8a8));
                  }
                  else if (local_3d0 == 5) {
                    local_78 = ZSTD_RowFindBestMatch_dedicatedDictSearch_5_5
                                         (in_stack_fffffffffffff8c0,
                                          (BYTE *)CONCAT44(in_stack_fffffffffffff8bc,
                                                           in_stack_fffffffffffff8b8),
                                          (BYTE *)CONCAT44(in_stack_fffffffffffff8b4,
                                                           in_stack_fffffffffffff8b0),
                                          (size_t *)
                                          CONCAT44(in_stack_fffffffffffff8ac,
                                                   in_stack_fffffffffffff8a8));
                  }
                  else {
                    if (local_3d0 != 6) {
                      __assert_fail("0",
                                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                                    ,0x793e,
                                    "size_t ZSTD_searchMax(ZSTD_matchState_t *, const BYTE *, const BYTE *, size_t *, const U32, const U32, const searchMethod_e, const ZSTD_dictMode_e)"
                                   );
                    }
                    local_78 = ZSTD_RowFindBestMatch_dedicatedDictSearch_5_6
                                         (in_stack_fffffffffffff8c0,
                                          (BYTE *)CONCAT44(in_stack_fffffffffffff8bc,
                                                           in_stack_fffffffffffff8b8),
                                          (BYTE *)CONCAT44(in_stack_fffffffffffff8b4,
                                                           in_stack_fffffffffffff8b0),
                                          (size_t *)
                                          CONCAT44(in_stack_fffffffffffff8ac,
                                                   in_stack_fffffffffffff8a8));
                  }
                }
                else {
                  if (local_3cc != 6) goto LAB_002570b9;
                  if (local_3d0 == 4) {
                    local_78 = ZSTD_RowFindBestMatch_dedicatedDictSearch_6_4
                                         (in_stack_fffffffffffff8c0,
                                          (BYTE *)CONCAT44(in_stack_fffffffffffff8bc,
                                                           in_stack_fffffffffffff8b8),
                                          (BYTE *)CONCAT44(in_stack_fffffffffffff8b4,
                                                           in_stack_fffffffffffff8b0),
                                          (size_t *)
                                          CONCAT44(in_stack_fffffffffffff8ac,
                                                   in_stack_fffffffffffff8a8));
                  }
                  else if (local_3d0 == 5) {
                    local_78 = ZSTD_RowFindBestMatch_dedicatedDictSearch_6_5
                                         (in_stack_fffffffffffff8c0,
                                          (BYTE *)CONCAT44(in_stack_fffffffffffff8bc,
                                                           in_stack_fffffffffffff8b8),
                                          (BYTE *)CONCAT44(in_stack_fffffffffffff8b4,
                                                           in_stack_fffffffffffff8b0),
                                          (size_t *)
                                          CONCAT44(in_stack_fffffffffffff8ac,
                                                   in_stack_fffffffffffff8a8));
                  }
                  else {
                    if (local_3d0 != 6) {
                      __assert_fail("0",
                                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                                    ,0x793e,
                                    "size_t ZSTD_searchMax(ZSTD_matchState_t *, const BYTE *, const BYTE *, size_t *, const U32, const U32, const searchMethod_e, const ZSTD_dictMode_e)"
                                   );
                    }
                    local_78 = ZSTD_RowFindBestMatch_dedicatedDictSearch_6_6
                                         (in_stack_fffffffffffff8c0,
                                          (BYTE *)CONCAT44(in_stack_fffffffffffff8bc,
                                                           in_stack_fffffffffffff8b8),
                                          (BYTE *)CONCAT44(in_stack_fffffffffffff8b4,
                                                           in_stack_fffffffffffff8b0),
                                          (size_t *)
                                          CONCAT44(in_stack_fffffffffffff8ac,
                                                   in_stack_fffffffffffff8a8));
                  }
                }
              }
            }
            uVar1 = local_78;
            in_stack_fffffffffffff840 = (BYTE *)(local_78 << 2);
            uVar6 = ZSTD_highbit32(0);
            iVar2 = (int)in_stack_fffffffffffff840;
            in_stack_fffffffffffff848 = (ZSTD_matchState_t *)(local_438 << 2);
            uVar5 = ZSTD_highbit32(0);
            if ((uVar1 < 4) ||
               ((int)(iVar2 - uVar6) <= (int)(((int)in_stack_fffffffffffff848 - uVar5) + 7))) break;
            local_438 = uVar1;
            local_440 = local_508;
            local_448 = local_398;
          }
          else {
            local_438 = local_4c0;
            local_440 = local_4b8;
            local_448 = local_398;
          }
        }
      }
      local_800 = in_stack_fffffffffffff7f8;
      if (3 < local_440) {
        uVar6 = in_stack_fffffffffffff830;
        if (local_384 == 0) {
          while( true ) {
            in_stack_fffffffffffff834 = (uint)(local_3a0 < local_448);
            if (local_440 < 4) {
              __assert_fail("OFFBASE_IS_OFFSET(offBase)",
                            "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                            ,0x7a0a,
                            "size_t ZSTD_compressBlock_lazy_generic(ZSTD_matchState_t *, seqStore_t *, U32 *, const void *, size_t, const searchMethod_e, const U32, const ZSTD_dictMode_e)"
                           );
            }
            uVar6 = in_stack_fffffffffffff830 & 0xffffff;
            if (local_3a0 < local_448 && local_3c8 < local_448 + -(local_440 - 3)) {
              if (local_440 < 4) {
                __assert_fail("OFFBASE_IS_OFFSET(offBase)",
                              "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                              ,0x7a0b,
                              "size_t ZSTD_compressBlock_lazy_generic(ZSTD_matchState_t *, seqStore_t *, U32 *, const void *, size_t, const searchMethod_e, const U32, const ZSTD_dictMode_e)"
                             );
              }
              uVar6 = CONCAT13(local_448[-1] == local_448[-1 - (local_440 - 3)],
                               (int3)in_stack_fffffffffffff830);
            }
            in_stack_fffffffffffff838 = local_448;
            if ((char)(uVar6 >> 0x18) == '\0') break;
            local_448 = local_448 + -1;
            local_438 = local_438 + 1;
            in_stack_fffffffffffff830 = uVar6;
          }
        }
        if (local_3ec != 0) {
          if (local_440 < 4) {
            __assert_fail("OFFBASE_IS_OFFSET(offBase)",
                          "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                          ,0x7a0f,
                          "size_t ZSTD_compressBlock_lazy_generic(ZSTD_matchState_t *, seqStore_t *, U32 *, const void *, size_t, const searchMethod_e, const U32, const ZSTD_dictMode_e)"
                         );
          }
          uVar5 = ((int)local_448 - (int)local_3b8) - ((int)local_440 + -3);
          if (uVar5 < local_3bc) {
            local_7f0 = (BYTE *)((local_408 + (ulong)uVar5) - (ulong)local_41c);
          }
          else {
            local_7f0 = local_3b8 + uVar5;
          }
          local_528 = local_7f0;
          if (uVar5 < local_3bc) {
            local_7f8 = local_410;
          }
          else {
            local_7f8 = local_3c8;
          }
          while( true ) {
            bVar9 = false;
            if ((local_3a0 < local_448) && (bVar9 = false, local_7f8 < local_528)) {
              bVar9 = local_448[-1] == local_528[-1];
            }
            if (!bVar9) break;
            local_448 = local_448 + -1;
            local_528 = local_528 + -1;
            local_438 = local_438 + 1;
          }
        }
        local_3d8 = local_3d4;
        if (local_440 < 4) {
          __assert_fail("OFFBASE_IS_OFFSET(offBase)",
                        "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                        ,0x7a14,
                        "size_t ZSTD_compressBlock_lazy_generic(ZSTD_matchState_t *, seqStore_t *, U32 *, const void *, size_t, const searchMethod_e, const U32, const ZSTD_dictMode_e)"
                       );
        }
        local_3d4 = (int)local_440 - 3;
        in_stack_fffffffffffff830 = uVar6;
      }
      goto LAB_00257525;
    }
    local_478 = ((ulong)((long)local_398 - (long)local_3a0) >> 8) + 1;
    local_398 = local_398 + local_478;
    local_358->lazySkipping = (uint)(8 < local_478);
  } while( true );
}

Assistant:

size_t ZSTD_compressBlock_greedy_row(
        ZSTD_matchState_t* ms, seqStore_t* seqStore, U32 rep[ZSTD_REP_NUM],
        void const* src, size_t srcSize)
{
    return ZSTD_compressBlock_lazy_generic(ms, seqStore, rep, src, srcSize, search_rowHash, 0, ZSTD_noDict);
}